

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::sse2::CurveNiIntersector1<4>::
     occluded_t<embree::sse2::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::sse2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  Primitive *pPVar5;
  Primitive PVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined6 uVar25;
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  int iVar41;
  undefined4 uVar42;
  ulong uVar43;
  long lVar44;
  long extraout_RAX;
  long extraout_RAX_00;
  long extraout_RAX_01;
  long extraout_RAX_02;
  long extraout_RAX_03;
  long extraout_RAX_04;
  long extraout_RAX_05;
  long extraout_RAX_06;
  ulong uVar45;
  byte bVar46;
  int iVar47;
  undefined4 uVar48;
  long lVar49;
  RTCFilterFunctionNArguments *pRVar51;
  long lVar52;
  byte bVar53;
  ulong uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  short sVar59;
  float fVar60;
  float fVar101;
  float fVar102;
  __m128 a_1;
  undefined2 uVar100;
  undefined1 auVar61 [16];
  undefined1 auVar64 [16];
  undefined1 auVar67 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar103;
  float fVar120;
  float fVar121;
  undefined1 auVar104 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar122;
  float fVar139;
  float fVar140;
  vfloat4 v;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar141;
  float fVar156;
  float fVar157;
  vfloat4 v_1;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar155 [16];
  float fVar158;
  float fVar175;
  float fVar176;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar177;
  float fVar183;
  float fVar184;
  vfloat4 a;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar185;
  float fVar195;
  float fVar196;
  undefined1 auVar186 [16];
  undefined1 auVar189 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar197;
  float fVar220;
  float fVar221;
  undefined1 auVar198 [16];
  undefined1 auVar201 [16];
  undefined1 auVar204 [16];
  undefined1 auVar207 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar222;
  float fVar232;
  float fVar233;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float t_1;
  float fVar234;
  float fVar239;
  float fVar240;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined4 uVar241;
  float fVar242;
  float fVar249;
  float fVar250;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar255;
  float fVar258;
  float fVar259;
  float fVar260;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  float fVar261;
  float fVar262;
  float fVar263;
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  float s;
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  RTCFilterFunctionNArguments args;
  vfloatx vu0;
  vfloat<4> A;
  vfloat<4> Oz;
  vfloat<4> dOz;
  vfloatx u_outer1;
  vfloatx u_outer0;
  vfloat<4> rl;
  BBox<embree::vfloat_impl<4>_> tp1;
  vfloat<4> B;
  vfloat<4> dOdO;
  BBox<embree::vfloat_impl<4>_> tp0;
  StackEntry stack [4];
  bool local_609;
  undefined4 local_5bc;
  float local_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  undefined1 local_5a8 [8];
  float fStack_5a0;
  float fStack_59c;
  undefined1 local_598 [8];
  float fStack_590;
  float fStack_58c;
  float local_588;
  float fStack_584;
  float fStack_580;
  float fStack_57c;
  undefined1 local_578 [8];
  float fStack_570;
  float fStack_56c;
  float local_568;
  float fStack_564;
  float fStack_560;
  float fStack_55c;
  undefined1 local_558 [8];
  float fStack_550;
  float fStack_54c;
  undefined1 local_548 [8];
  float fStack_540;
  float fStack_53c;
  undefined1 local_538 [8];
  float fStack_530;
  float fStack_52c;
  undefined1 local_528 [8];
  float fStack_520;
  float fStack_51c;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 local_518;
  ulong local_500;
  undefined1 local_4f8 [8];
  float fStack_4f0;
  float fStack_4ec;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  RTCFilterFunctionNArguments *local_4b0;
  RTCFilterFunctionNArguments local_4a8;
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  undefined8 local_438;
  float fStack_430;
  float fStack_42c;
  undefined4 local_428;
  undefined4 local_424;
  undefined4 local_420;
  uint local_41c;
  uint local_418;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  float local_3f8;
  float fStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [16];
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  ulong local_370;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [16];
  float local_2d8 [4];
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  Primitive *local_2b8;
  ulong local_2b0;
  undefined1 local_2a8 [16];
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [16];
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [16];
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  uint local_f8 [4];
  float afStack_e8 [6];
  float local_d0 [40];
  ulong uVar50;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 uVar99;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar131 [16];
  undefined1 auVar134 [16];
  undefined1 auVar150 [16];
  undefined1 auVar154 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  
  PVar6 = prim[1];
  uVar43 = (ulong)(byte)PVar6;
  pPVar5 = prim + uVar43 * 0x19 + 6;
  fVar140 = *(float *)(pPVar5 + 0xc);
  fVar141 = ((ray->org).field_0.m128[0] - *(float *)pPVar5) * fVar140;
  fVar156 = ((ray->org).field_0.m128[1] - *(float *)(pPVar5 + 4)) * fVar140;
  fVar157 = ((ray->org).field_0.m128[2] - *(float *)(pPVar5 + 8)) * fVar140;
  fVar122 = fVar140 * (ray->dir).field_0.m128[0];
  fVar139 = fVar140 * (ray->dir).field_0.m128[1];
  fVar140 = fVar140 * (ray->dir).field_0.m128[2];
  uVar48 = *(undefined4 *)(prim + uVar43 * 4 + 6);
  uVar99 = (undefined1)((uint)uVar48 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar48 >> 0x10);
  uVar13 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar48));
  uVar99 = (undefined1)((uint)uVar48 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar13 >> 0x20),uVar99),uVar99);
  sVar59 = CONCAT11((char)uVar48,(char)uVar48);
  uVar54 = CONCAT62(uVar25,sVar59);
  auVar225._8_4_ = 0;
  auVar225._0_8_ = uVar54;
  auVar225._12_2_ = uVar100;
  auVar225._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar13 >> 0x20);
  auVar214._12_4_ = auVar225._12_4_;
  auVar214._8_2_ = 0;
  auVar214._0_8_ = uVar54;
  auVar214._10_2_ = uVar100;
  auVar215._10_6_ = auVar214._10_6_;
  auVar215._8_2_ = uVar100;
  auVar215._0_8_ = uVar54;
  uVar100 = (undefined2)uVar25;
  auVar26._4_8_ = auVar215._8_8_;
  auVar26._2_2_ = uVar100;
  auVar26._0_2_ = uVar100;
  fVar103 = (float)((int)sVar59 >> 8);
  fVar120 = (float)(auVar26._0_4_ >> 0x18);
  fVar121 = (float)(auVar215._8_4_ >> 0x18);
  uVar48 = *(undefined4 *)(prim + uVar43 * 5 + 6);
  uVar99 = (undefined1)((uint)uVar48 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar48 >> 0x10);
  uVar13 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar48));
  uVar99 = (undefined1)((uint)uVar48 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar13 >> 0x20),uVar99),uVar99);
  sVar59 = CONCAT11((char)uVar48,(char)uVar48);
  uVar54 = CONCAT62(uVar25,sVar59);
  auVar63._8_4_ = 0;
  auVar63._0_8_ = uVar54;
  auVar63._12_2_ = uVar100;
  auVar63._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar13 >> 0x20);
  auVar62._12_4_ = auVar63._12_4_;
  auVar62._8_2_ = 0;
  auVar62._0_8_ = uVar54;
  auVar62._10_2_ = uVar100;
  auVar61._10_6_ = auVar62._10_6_;
  auVar61._8_2_ = uVar100;
  auVar61._0_8_ = uVar54;
  uVar100 = (undefined2)uVar25;
  auVar27._4_8_ = auVar61._8_8_;
  auVar27._2_2_ = uVar100;
  auVar27._0_2_ = uVar100;
  fVar158 = (float)((int)sVar59 >> 8);
  fVar175 = (float)(auVar27._0_4_ >> 0x18);
  fVar176 = (float)(auVar61._8_4_ >> 0x18);
  uVar48 = *(undefined4 *)(prim + uVar43 * 6 + 6);
  uVar99 = (undefined1)((uint)uVar48 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar48 >> 0x10);
  uVar13 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar48));
  uVar99 = (undefined1)((uint)uVar48 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar13 >> 0x20),uVar99),uVar99);
  sVar59 = CONCAT11((char)uVar48,(char)uVar48);
  uVar54 = CONCAT62(uVar25,sVar59);
  auVar66._8_4_ = 0;
  auVar66._0_8_ = uVar54;
  auVar66._12_2_ = uVar100;
  auVar66._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar13 >> 0x20);
  auVar65._12_4_ = auVar66._12_4_;
  auVar65._8_2_ = 0;
  auVar65._0_8_ = uVar54;
  auVar65._10_2_ = uVar100;
  auVar64._10_6_ = auVar65._10_6_;
  auVar64._8_2_ = uVar100;
  auVar64._0_8_ = uVar54;
  uVar100 = (undefined2)uVar25;
  auVar28._4_8_ = auVar64._8_8_;
  auVar28._2_2_ = uVar100;
  auVar28._0_2_ = uVar100;
  fVar177 = (float)((int)sVar59 >> 8);
  fVar183 = (float)(auVar28._0_4_ >> 0x18);
  fVar184 = (float)(auVar64._8_4_ >> 0x18);
  uVar48 = *(undefined4 *)(prim + uVar43 * 0xb + 6);
  uVar99 = (undefined1)((uint)uVar48 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar48 >> 0x10);
  uVar13 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar48));
  uVar99 = (undefined1)((uint)uVar48 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar13 >> 0x20),uVar99),uVar99);
  sVar59 = CONCAT11((char)uVar48,(char)uVar48);
  uVar54 = CONCAT62(uVar25,sVar59);
  auVar69._8_4_ = 0;
  auVar69._0_8_ = uVar54;
  auVar69._12_2_ = uVar100;
  auVar69._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar13 >> 0x20);
  auVar68._12_4_ = auVar69._12_4_;
  auVar68._8_2_ = 0;
  auVar68._0_8_ = uVar54;
  auVar68._10_2_ = uVar100;
  auVar67._10_6_ = auVar68._10_6_;
  auVar67._8_2_ = uVar100;
  auVar67._0_8_ = uVar54;
  uVar100 = (undefined2)uVar25;
  auVar29._4_8_ = auVar67._8_8_;
  auVar29._2_2_ = uVar100;
  auVar29._0_2_ = uVar100;
  fVar60 = (float)((int)sVar59 >> 8);
  fVar101 = (float)(auVar29._0_4_ >> 0x18);
  fVar102 = (float)(auVar67._8_4_ >> 0x18);
  uVar48 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6);
  uVar99 = (undefined1)((uint)uVar48 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar48 >> 0x10);
  uVar13 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar48));
  uVar99 = (undefined1)((uint)uVar48 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar13 >> 0x20),uVar99),uVar99);
  sVar59 = CONCAT11((char)uVar48,(char)uVar48);
  uVar54 = CONCAT62(uVar25,sVar59);
  auVar188._8_4_ = 0;
  auVar188._0_8_ = uVar54;
  auVar188._12_2_ = uVar100;
  auVar188._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar13 >> 0x20);
  auVar187._12_4_ = auVar188._12_4_;
  auVar187._8_2_ = 0;
  auVar187._0_8_ = uVar54;
  auVar187._10_2_ = uVar100;
  auVar186._10_6_ = auVar187._10_6_;
  auVar186._8_2_ = uVar100;
  auVar186._0_8_ = uVar54;
  uVar100 = (undefined2)uVar25;
  auVar30._4_8_ = auVar186._8_8_;
  auVar30._2_2_ = uVar100;
  auVar30._0_2_ = uVar100;
  fVar185 = (float)((int)sVar59 >> 8);
  fVar195 = (float)(auVar30._0_4_ >> 0x18);
  fVar196 = (float)(auVar186._8_4_ >> 0x18);
  uVar48 = *(undefined4 *)(prim + (uint)(byte)PVar6 * 0xc + uVar43 + 6);
  uVar99 = (undefined1)((uint)uVar48 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar48 >> 0x10);
  uVar13 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar48));
  uVar99 = (undefined1)((uint)uVar48 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar13 >> 0x20),uVar99),uVar99);
  sVar59 = CONCAT11((char)uVar48,(char)uVar48);
  uVar54 = CONCAT62(uVar25,sVar59);
  auVar200._8_4_ = 0;
  auVar200._0_8_ = uVar54;
  auVar200._12_2_ = uVar100;
  auVar200._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar13 >> 0x20);
  auVar199._12_4_ = auVar200._12_4_;
  auVar199._8_2_ = 0;
  auVar199._0_8_ = uVar54;
  auVar199._10_2_ = uVar100;
  auVar198._10_6_ = auVar199._10_6_;
  auVar198._8_2_ = uVar100;
  auVar198._0_8_ = uVar54;
  uVar100 = (undefined2)uVar25;
  auVar31._4_8_ = auVar198._8_8_;
  auVar31._2_2_ = uVar100;
  auVar31._0_2_ = uVar100;
  fVar234 = (float)((int)sVar59 >> 8);
  fVar239 = (float)(auVar31._0_4_ >> 0x18);
  fVar240 = (float)(auVar198._8_4_ >> 0x18);
  uVar45 = (ulong)(uint)((int)(uVar43 * 9) * 2);
  uVar48 = *(undefined4 *)(prim + uVar45 + 6);
  uVar99 = (undefined1)((uint)uVar48 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar48 >> 0x10);
  uVar13 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar48));
  uVar99 = (undefined1)((uint)uVar48 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar13 >> 0x20),uVar99),uVar99);
  sVar59 = CONCAT11((char)uVar48,(char)uVar48);
  uVar54 = CONCAT62(uVar25,sVar59);
  auVar203._8_4_ = 0;
  auVar203._0_8_ = uVar54;
  auVar203._12_2_ = uVar100;
  auVar203._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar13 >> 0x20);
  auVar202._12_4_ = auVar203._12_4_;
  auVar202._8_2_ = 0;
  auVar202._0_8_ = uVar54;
  auVar202._10_2_ = uVar100;
  auVar201._10_6_ = auVar202._10_6_;
  auVar201._8_2_ = uVar100;
  auVar201._0_8_ = uVar54;
  uVar100 = (undefined2)uVar25;
  auVar32._4_8_ = auVar201._8_8_;
  auVar32._2_2_ = uVar100;
  auVar32._0_2_ = uVar100;
  fVar222 = (float)((int)sVar59 >> 8);
  fVar232 = (float)(auVar32._0_4_ >> 0x18);
  fVar233 = (float)(auVar201._8_4_ >> 0x18);
  uVar48 = *(undefined4 *)(prim + uVar45 + uVar43 + 6);
  uVar99 = (undefined1)((uint)uVar48 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar48 >> 0x10);
  uVar13 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar48));
  uVar99 = (undefined1)((uint)uVar48 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar13 >> 0x20),uVar99),uVar99);
  sVar59 = CONCAT11((char)uVar48,(char)uVar48);
  uVar54 = CONCAT62(uVar25,sVar59);
  auVar206._8_4_ = 0;
  auVar206._0_8_ = uVar54;
  auVar206._12_2_ = uVar100;
  auVar206._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar13 >> 0x20);
  auVar205._12_4_ = auVar206._12_4_;
  auVar205._8_2_ = 0;
  auVar205._0_8_ = uVar54;
  auVar205._10_2_ = uVar100;
  auVar204._10_6_ = auVar205._10_6_;
  auVar204._8_2_ = uVar100;
  auVar204._0_8_ = uVar54;
  uVar100 = (undefined2)uVar25;
  auVar33._4_8_ = auVar204._8_8_;
  auVar33._2_2_ = uVar100;
  auVar33._0_2_ = uVar100;
  fVar242 = (float)((int)sVar59 >> 8);
  fVar249 = (float)(auVar33._0_4_ >> 0x18);
  fVar250 = (float)(auVar204._8_4_ >> 0x18);
  uVar50 = (ulong)(uint)((int)(uVar43 * 5) << 2);
  uVar48 = *(undefined4 *)(prim + uVar50 + 6);
  uVar99 = (undefined1)((uint)uVar48 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar48 >> 0x10);
  uVar13 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar48));
  uVar99 = (undefined1)((uint)uVar48 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar13 >> 0x20),uVar99),uVar99);
  sVar59 = CONCAT11((char)uVar48,(char)uVar48);
  uVar54 = CONCAT62(uVar25,sVar59);
  auVar209._8_4_ = 0;
  auVar209._0_8_ = uVar54;
  auVar209._12_2_ = uVar100;
  auVar209._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar13 >> 0x20);
  auVar208._12_4_ = auVar209._12_4_;
  auVar208._8_2_ = 0;
  auVar208._0_8_ = uVar54;
  auVar208._10_2_ = uVar100;
  auVar207._10_6_ = auVar208._10_6_;
  auVar207._8_2_ = uVar100;
  auVar207._0_8_ = uVar54;
  uVar100 = (undefined2)uVar25;
  auVar34._4_8_ = auVar207._8_8_;
  auVar34._2_2_ = uVar100;
  auVar34._0_2_ = uVar100;
  fVar261 = (float)((int)sVar59 >> 8);
  fVar262 = (float)(auVar34._0_4_ >> 0x18);
  fVar263 = (float)(auVar207._8_4_ >> 0x18);
  fVar255 = fVar122 * fVar103 + fVar139 * fVar158 + fVar140 * fVar177;
  fVar258 = fVar122 * fVar120 + fVar139 * fVar175 + fVar140 * fVar183;
  fVar259 = fVar122 * fVar121 + fVar139 * fVar176 + fVar140 * fVar184;
  fVar260 = fVar122 * (float)(auVar214._12_4_ >> 0x18) +
            fVar139 * (float)(auVar62._12_4_ >> 0x18) + fVar140 * (float)(auVar65._12_4_ >> 0x18);
  fVar251 = fVar122 * fVar60 + fVar139 * fVar185 + fVar140 * fVar234;
  fVar252 = fVar122 * fVar101 + fVar139 * fVar195 + fVar140 * fVar239;
  fVar253 = fVar122 * fVar102 + fVar139 * fVar196 + fVar140 * fVar240;
  fVar254 = fVar122 * (float)(auVar68._12_4_ >> 0x18) +
            fVar139 * (float)(auVar187._12_4_ >> 0x18) + fVar140 * (float)(auVar199._12_4_ >> 0x18);
  fVar197 = fVar122 * fVar222 + fVar139 * fVar242 + fVar140 * fVar261;
  fVar220 = fVar122 * fVar232 + fVar139 * fVar249 + fVar140 * fVar262;
  fVar221 = fVar122 * fVar233 + fVar139 * fVar250 + fVar140 * fVar263;
  fVar122 = fVar122 * (float)(auVar202._12_4_ >> 0x18) +
            fVar139 * (float)(auVar205._12_4_ >> 0x18) + fVar140 * (float)(auVar208._12_4_ >> 0x18);
  fVar158 = fVar103 * fVar141 + fVar158 * fVar156 + fVar177 * fVar157;
  fVar175 = fVar120 * fVar141 + fVar175 * fVar156 + fVar183 * fVar157;
  fVar176 = fVar121 * fVar141 + fVar176 * fVar156 + fVar184 * fVar157;
  fVar177 = (float)(auVar214._12_4_ >> 0x18) * fVar141 +
            (float)(auVar62._12_4_ >> 0x18) * fVar156 + (float)(auVar65._12_4_ >> 0x18) * fVar157;
  fVar234 = fVar60 * fVar141 + fVar185 * fVar156 + fVar234 * fVar157;
  fVar239 = fVar101 * fVar141 + fVar195 * fVar156 + fVar239 * fVar157;
  fVar196 = fVar102 * fVar141 + fVar196 * fVar156 + fVar240 * fVar157;
  fVar240 = (float)(auVar68._12_4_ >> 0x18) * fVar141 +
            (float)(auVar187._12_4_ >> 0x18) * fVar156 + (float)(auVar199._12_4_ >> 0x18) * fVar157;
  fVar183 = fVar141 * fVar222 + fVar156 * fVar242 + fVar157 * fVar261;
  fVar184 = fVar141 * fVar232 + fVar156 * fVar249 + fVar157 * fVar262;
  fVar185 = fVar141 * fVar233 + fVar156 * fVar250 + fVar157 * fVar263;
  fVar195 = fVar141 * (float)(auVar202._12_4_ >> 0x18) +
            fVar156 * (float)(auVar205._12_4_ >> 0x18) + fVar157 * (float)(auVar208._12_4_ >> 0x18);
  fVar140 = (float)DAT_01ff1d40;
  fVar60 = DAT_01ff1d40._4_4_;
  fVar101 = DAT_01ff1d40._8_4_;
  fVar102 = DAT_01ff1d40._12_4_;
  uVar55 = -(uint)(fVar140 <= ABS(fVar255));
  uVar56 = -(uint)(fVar60 <= ABS(fVar258));
  uVar57 = -(uint)(fVar101 <= ABS(fVar259));
  uVar58 = -(uint)(fVar102 <= ABS(fVar260));
  auVar256._0_4_ = (uint)fVar255 & uVar55;
  auVar256._4_4_ = (uint)fVar258 & uVar56;
  auVar256._8_4_ = (uint)fVar259 & uVar57;
  auVar256._12_4_ = (uint)fVar260 & uVar58;
  auVar142._0_4_ = ~uVar55 & (uint)fVar140;
  auVar142._4_4_ = ~uVar56 & (uint)fVar60;
  auVar142._8_4_ = ~uVar57 & (uint)fVar101;
  auVar142._12_4_ = ~uVar58 & (uint)fVar102;
  auVar142 = auVar142 | auVar256;
  uVar55 = -(uint)(fVar140 <= ABS(fVar251));
  uVar56 = -(uint)(fVar60 <= ABS(fVar252));
  uVar57 = -(uint)(fVar101 <= ABS(fVar253));
  uVar58 = -(uint)(fVar102 <= ABS(fVar254));
  auVar159._0_4_ = ~uVar55 & (uint)fVar140;
  auVar159._4_4_ = ~uVar56 & (uint)fVar60;
  auVar159._8_4_ = ~uVar57 & (uint)fVar101;
  auVar159._12_4_ = ~uVar58 & (uint)fVar102;
  auVar70._4_4_ = (uint)fVar252 & uVar56;
  auVar70._0_4_ = (uint)fVar251 & uVar55;
  auVar70._8_4_ = (uint)fVar253 & uVar57;
  auVar70._12_4_ = (uint)fVar254 & uVar58;
  auVar159 = auVar159 | auVar70;
  uVar55 = -(uint)(fVar140 <= ABS(fVar197));
  uVar56 = -(uint)(fVar60 <= ABS(fVar220));
  uVar57 = -(uint)(fVar101 <= ABS(fVar221));
  uVar58 = -(uint)(fVar102 <= ABS(fVar122));
  auVar210._0_4_ = (uint)fVar197 & uVar55;
  auVar210._4_4_ = (uint)fVar220 & uVar56;
  auVar210._8_4_ = (uint)fVar221 & uVar57;
  auVar210._12_4_ = (uint)fVar122 & uVar58;
  auVar223._0_4_ = ~uVar55 & (uint)fVar140;
  auVar223._4_4_ = ~uVar56 & (uint)fVar60;
  auVar223._8_4_ = ~uVar57 & (uint)fVar101;
  auVar223._12_4_ = ~uVar58 & (uint)fVar102;
  auVar223 = auVar223 | auVar210;
  auVar70 = rcpps(_DAT_01ff1d40,auVar142);
  fVar140 = auVar70._0_4_;
  fVar102 = auVar70._4_4_;
  fVar121 = auVar70._8_4_;
  fVar141 = auVar70._12_4_;
  fVar140 = (1.0 - auVar142._0_4_ * fVar140) * fVar140 + fVar140;
  fVar102 = (1.0 - auVar142._4_4_ * fVar102) * fVar102 + fVar102;
  fVar121 = (1.0 - auVar142._8_4_ * fVar121) * fVar121 + fVar121;
  fVar141 = (1.0 - auVar142._12_4_ * fVar141) * fVar141 + fVar141;
  auVar70 = rcpps(auVar70,auVar159);
  fVar60 = auVar70._0_4_;
  fVar103 = auVar70._4_4_;
  fVar122 = auVar70._8_4_;
  fVar156 = auVar70._12_4_;
  fVar60 = (1.0 - auVar159._0_4_ * fVar60) * fVar60 + fVar60;
  fVar103 = (1.0 - auVar159._4_4_ * fVar103) * fVar103 + fVar103;
  fVar122 = (1.0 - auVar159._8_4_ * fVar122) * fVar122 + fVar122;
  fVar156 = (1.0 - auVar159._12_4_ * fVar156) * fVar156 + fVar156;
  auVar70 = rcpps(auVar70,auVar223);
  fVar101 = auVar70._0_4_;
  fVar120 = auVar70._4_4_;
  fVar139 = auVar70._8_4_;
  fVar157 = auVar70._12_4_;
  fVar101 = (1.0 - auVar223._0_4_ * fVar101) * fVar101 + fVar101;
  fVar120 = (1.0 - auVar223._4_4_ * fVar120) * fVar120 + fVar120;
  fVar139 = (1.0 - auVar223._8_4_ * fVar139) * fVar139 + fVar139;
  fVar157 = (1.0 - auVar223._12_4_ * fVar157) * fVar157 + fVar157;
  uVar54 = *(ulong *)(prim + uVar43 * 7 + 6);
  uVar100 = (undefined2)(uVar54 >> 0x30);
  auVar73._8_4_ = 0;
  auVar73._0_8_ = uVar54;
  auVar73._12_2_ = uVar100;
  auVar73._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar54 >> 0x20);
  auVar72._12_4_ = auVar73._12_4_;
  auVar72._8_2_ = 0;
  auVar72._0_8_ = uVar54;
  auVar72._10_2_ = uVar100;
  auVar71._10_6_ = auVar72._10_6_;
  auVar71._8_2_ = uVar100;
  auVar71._0_8_ = uVar54;
  uVar100 = (undefined2)(uVar54 >> 0x10);
  auVar35._4_8_ = auVar71._8_8_;
  auVar35._2_2_ = uVar100;
  auVar35._0_2_ = uVar100;
  auVar143._0_8_ =
       CONCAT44(((float)(auVar35._0_4_ >> 0x10) - fVar175) * fVar102,
                ((float)(int)(short)uVar54 - fVar158) * fVar140);
  auVar143._8_4_ = ((float)(auVar71._8_4_ >> 0x10) - fVar176) * fVar121;
  auVar143._12_4_ = ((float)(auVar72._12_4_ >> 0x10) - fVar177) * fVar141;
  uVar54 = *(ulong *)(prim + uVar43 * 9 + 6);
  uVar100 = (undefined2)(uVar54 >> 0x30);
  auVar76._8_4_ = 0;
  auVar76._0_8_ = uVar54;
  auVar76._12_2_ = uVar100;
  auVar76._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar54 >> 0x20);
  auVar75._12_4_ = auVar76._12_4_;
  auVar75._8_2_ = 0;
  auVar75._0_8_ = uVar54;
  auVar75._10_2_ = uVar100;
  auVar74._10_6_ = auVar75._10_6_;
  auVar74._8_2_ = uVar100;
  auVar74._0_8_ = uVar54;
  uVar100 = (undefined2)(uVar54 >> 0x10);
  auVar36._4_8_ = auVar74._8_8_;
  auVar36._2_2_ = uVar100;
  auVar36._0_2_ = uVar100;
  auVar160._0_4_ = ((float)(int)(short)uVar54 - fVar158) * fVar140;
  auVar160._4_4_ = ((float)(auVar36._0_4_ >> 0x10) - fVar175) * fVar102;
  auVar160._8_4_ = ((float)(auVar74._8_4_ >> 0x10) - fVar176) * fVar121;
  auVar160._12_4_ = ((float)(auVar75._12_4_ >> 0x10) - fVar177) * fVar141;
  uVar54 = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  uVar45 = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar43 * -2 + 6);
  uVar100 = (undefined2)(uVar45 >> 0x30);
  auVar106._8_4_ = 0;
  auVar106._0_8_ = uVar45;
  auVar106._12_2_ = uVar100;
  auVar106._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar45 >> 0x20);
  auVar105._12_4_ = auVar106._12_4_;
  auVar105._8_2_ = 0;
  auVar105._0_8_ = uVar45;
  auVar105._10_2_ = uVar100;
  auVar104._10_6_ = auVar105._10_6_;
  auVar104._8_2_ = uVar100;
  auVar104._0_8_ = uVar45;
  uVar100 = (undefined2)(uVar45 >> 0x10);
  auVar37._4_8_ = auVar104._8_8_;
  auVar37._2_2_ = uVar100;
  auVar37._0_2_ = uVar100;
  auVar107._0_8_ =
       CONCAT44(((float)(auVar37._0_4_ >> 0x10) - fVar239) * fVar103,
                ((float)(int)(short)uVar45 - fVar234) * fVar60);
  auVar107._8_4_ = ((float)(auVar104._8_4_ >> 0x10) - fVar196) * fVar122;
  auVar107._12_4_ = ((float)(auVar105._12_4_ >> 0x10) - fVar240) * fVar156;
  uVar100 = (undefined2)(uVar54 >> 0x30);
  auVar79._8_4_ = 0;
  auVar79._0_8_ = uVar54;
  auVar79._12_2_ = uVar100;
  auVar79._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar54 >> 0x20);
  auVar78._12_4_ = auVar79._12_4_;
  auVar78._8_2_ = 0;
  auVar78._0_8_ = uVar54;
  auVar78._10_2_ = uVar100;
  auVar77._10_6_ = auVar78._10_6_;
  auVar77._8_2_ = uVar100;
  auVar77._0_8_ = uVar54;
  uVar100 = (undefined2)(uVar54 >> 0x10);
  auVar38._4_8_ = auVar77._8_8_;
  auVar38._2_2_ = uVar100;
  auVar38._0_2_ = uVar100;
  auVar211._0_4_ = ((float)(int)(short)uVar54 - fVar234) * fVar60;
  auVar211._4_4_ = ((float)(auVar38._0_4_ >> 0x10) - fVar239) * fVar103;
  auVar211._8_4_ = ((float)(auVar77._8_4_ >> 0x10) - fVar196) * fVar122;
  auVar211._12_4_ = ((float)(auVar78._12_4_ >> 0x10) - fVar240) * fVar156;
  uVar54 = *(ulong *)(prim + uVar50 + uVar43 + 6);
  uVar100 = (undefined2)(uVar54 >> 0x30);
  auVar82._8_4_ = 0;
  auVar82._0_8_ = uVar54;
  auVar82._12_2_ = uVar100;
  auVar82._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar54 >> 0x20);
  auVar81._12_4_ = auVar82._12_4_;
  auVar81._8_2_ = 0;
  auVar81._0_8_ = uVar54;
  auVar81._10_2_ = uVar100;
  auVar80._10_6_ = auVar81._10_6_;
  auVar80._8_2_ = uVar100;
  auVar80._0_8_ = uVar54;
  uVar100 = (undefined2)(uVar54 >> 0x10);
  auVar39._4_8_ = auVar80._8_8_;
  auVar39._2_2_ = uVar100;
  auVar39._0_2_ = uVar100;
  auVar83._0_8_ =
       CONCAT44(((float)(auVar39._0_4_ >> 0x10) - fVar184) * fVar120,
                ((float)(int)(short)uVar54 - fVar183) * fVar101);
  auVar83._8_4_ = ((float)(auVar80._8_4_ >> 0x10) - fVar185) * fVar139;
  auVar83._12_4_ = ((float)(auVar81._12_4_ >> 0x10) - fVar195) * fVar157;
  uVar54 = *(ulong *)(prim + uVar43 * 0x17 + 6);
  uVar100 = (undefined2)(uVar54 >> 0x30);
  auVar191._8_4_ = 0;
  auVar191._0_8_ = uVar54;
  auVar191._12_2_ = uVar100;
  auVar191._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar54 >> 0x20);
  auVar190._12_4_ = auVar191._12_4_;
  auVar190._8_2_ = 0;
  auVar190._0_8_ = uVar54;
  auVar190._10_2_ = uVar100;
  auVar189._10_6_ = auVar190._10_6_;
  auVar189._8_2_ = uVar100;
  auVar189._0_8_ = uVar54;
  uVar100 = (undefined2)(uVar54 >> 0x10);
  auVar40._4_8_ = auVar189._8_8_;
  auVar40._2_2_ = uVar100;
  auVar40._0_2_ = uVar100;
  auVar192._0_4_ = ((float)(int)(short)uVar54 - fVar183) * fVar101;
  auVar192._4_4_ = ((float)(auVar40._0_4_ >> 0x10) - fVar184) * fVar120;
  auVar192._8_4_ = ((float)(auVar189._8_4_ >> 0x10) - fVar185) * fVar139;
  auVar192._12_4_ = ((float)(auVar190._12_4_ >> 0x10) - fVar195) * fVar157;
  auVar224._8_4_ = auVar143._8_4_;
  auVar224._0_8_ = auVar143._0_8_;
  auVar224._12_4_ = auVar143._12_4_;
  auVar225 = minps(auVar224,auVar160);
  auVar123._8_4_ = auVar107._8_4_;
  auVar123._0_8_ = auVar107._0_8_;
  auVar123._12_4_ = auVar107._12_4_;
  auVar70 = minps(auVar123,auVar211);
  auVar225 = maxps(auVar225,auVar70);
  auVar124._8_4_ = auVar83._8_4_;
  auVar124._0_8_ = auVar83._0_8_;
  auVar124._12_4_ = auVar83._12_4_;
  auVar70 = minps(auVar124,auVar192);
  uVar48 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar178._4_4_ = uVar48;
  auVar178._0_4_ = uVar48;
  auVar178._8_4_ = uVar48;
  auVar178._12_4_ = uVar48;
  auVar70 = maxps(auVar70,auVar178);
  auVar70 = maxps(auVar225,auVar70);
  local_188 = auVar70._0_4_ * 0.99999964;
  fStack_184 = auVar70._4_4_ * 0.99999964;
  fStack_180 = auVar70._8_4_ * 0.99999964;
  fStack_17c = auVar70._12_4_ * 0.99999964;
  auVar225 = maxps(auVar143,auVar160);
  auVar70 = maxps(auVar107,auVar211);
  auVar225 = minps(auVar225,auVar70);
  auVar70 = maxps(auVar83,auVar192);
  fVar140 = ray->tfar;
  auVar108._4_4_ = fVar140;
  auVar108._0_4_ = fVar140;
  auVar108._8_4_ = fVar140;
  auVar108._12_4_ = fVar140;
  auVar70 = minps(auVar70,auVar108);
  auVar70 = minps(auVar225,auVar70);
  auVar109._0_4_ = -(uint)(PVar6 != (Primitive)0x0 && local_188 <= auVar70._0_4_ * 1.0000004);
  auVar109._4_4_ = -(uint)(1 < (byte)PVar6 && fStack_184 <= auVar70._4_4_ * 1.0000004);
  auVar109._8_4_ = -(uint)(2 < (byte)PVar6 && fStack_180 <= auVar70._8_4_ * 1.0000004);
  auVar109._12_4_ = -(uint)(3 < (byte)PVar6 && fStack_17c <= auVar70._12_4_ * 1.0000004);
  uVar55 = movmskps((uint)(byte)PVar6,auVar109);
  local_609 = uVar55 != 0;
  if (uVar55 == 0) {
    return local_609;
  }
  uVar55 = uVar55 & 0xff;
  local_158._0_12_ = mm_lookupmask_ps._240_12_;
  local_158._12_4_ = 0;
  local_2b8 = prim;
LAB_00b580ca:
  uVar54 = (ulong)uVar55;
  lVar49 = 0;
  if (uVar54 != 0) {
    for (; (uVar55 >> lVar49 & 1) == 0; lVar49 = lVar49 + 1) {
    }
  }
  uVar54 = uVar54 - 1 & uVar54;
  local_500 = (ulong)*(uint *)(local_2b8 + 2);
  pGVar7 = (context->scene->geometries).items[local_500].ptr;
  local_370 = (ulong)*(uint *)(local_2b8 + lVar49 * 4 + 6);
  uVar45 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(local_2b8 + lVar49 * 4 + 6));
  p_Var8 = pGVar7[1].intersectionFilterN;
  lVar49 = 0;
  if (uVar54 != 0) {
    for (; (uVar54 >> lVar49 & 1) == 0; lVar49 = lVar49 + 1) {
    }
  }
  lVar49 = *(long *)&pGVar7[1].time_range.upper;
  pfVar1 = (float *)(lVar49 + (long)p_Var8 * uVar45);
  pfVar2 = (float *)(lVar49 + (uVar45 + 1) * (long)p_Var8);
  pfVar3 = (float *)(lVar49 + (uVar45 + 2) * (long)p_Var8);
  pfVar4 = (float *)(lVar49 + (uVar45 + 3) * (long)p_Var8);
  pRVar51 = (RTCFilterFunctionNArguments *)(uVar54 - 1);
  if ((uVar54 != 0) &&
     (pRVar51 = (RTCFilterFunctionNArguments *)((ulong)pRVar51 & uVar54),
     pRVar51 != (RTCFilterFunctionNArguments *)0x0)) {
    lVar44 = 0;
    if (pRVar51 != (RTCFilterFunctionNArguments *)0x0) {
      for (; ((ulong)pRVar51 >> lVar44 & 1) == 0; lVar44 = lVar44 + 1) {
      }
    }
    pRVar51 = (RTCFilterFunctionNArguments *)(ulong)*(uint *)(local_2b8 + lVar44 * 4 + 6);
  }
  local_2b0 = uVar54;
  local_468 = (ray->org).field_0.m128[0];
  fStack_464 = (ray->org).field_0.m128[1];
  fStack_460 = (ray->org).field_0.m128[2];
  local_308 = (ray->dir).field_0.m128[0];
  local_4d8 = (ray->dir).field_0.m128[1];
  local_2f8 = (ray->dir).field_0.m128[2];
  fVar140 = (ray->dir).field_0.m128[3];
  fStack_11c = local_308 * local_308;
  fVar101 = local_4d8 * local_4d8;
  fVar102 = local_2f8 * local_2f8;
  fVar140 = fVar140 * fVar140;
  fVar60 = fStack_11c + fVar101 + fVar102;
  auVar161._0_8_ = CONCAT44(fVar101 + fVar101 + fVar140,fVar60);
  auVar161._8_4_ = fVar102 + fVar101 + fVar102;
  auVar161._12_4_ = fVar140 + fVar101 + fVar140;
  auVar144._8_4_ = auVar161._8_4_;
  auVar144._0_8_ = auVar161._0_8_;
  auVar144._12_4_ = auVar161._12_4_;
  auVar70 = rcpss(auVar144,auVar161);
  local_4c8 = (2.0 - fVar60 * auVar70._0_4_) * auVar70._0_4_ *
              (((pfVar1[2] + pfVar2[2]) * 0.5 - fStack_460) * local_2f8 +
              ((pfVar1[1] + pfVar2[1]) * 0.5 - fStack_464) * local_4d8 +
              ((*pfVar1 + *pfVar2) * 0.5 - local_468) * local_308);
  local_2e8 = ZEXT416((uint)local_4c8);
  local_468 = local_308 * local_4c8 + local_468;
  fStack_464 = local_4d8 * local_4c8 + fStack_464;
  fStack_460 = local_2f8 * local_4c8 + fStack_460;
  local_4e8 = *pfVar1 - local_468;
  fStack_4e4 = pfVar1[1] - fStack_464;
  fStack_4e0 = pfVar1[2] - fStack_460;
  fStack_4dc = pfVar1[3] - 0.0;
  local_458 = *pfVar3 - local_468;
  fStack_454 = pfVar3[1] - fStack_464;
  fStack_450 = pfVar3[2] - fStack_460;
  fStack_44c = pfVar3[3] - 0.0;
  local_448 = *pfVar2 - local_468;
  fStack_444 = pfVar2[1] - fStack_464;
  fStack_440 = pfVar2[2] - fStack_460;
  fStack_43c = pfVar2[3] - 0.0;
  local_468 = *pfVar4 - local_468;
  fStack_464 = pfVar4[1] - fStack_464;
  fStack_460 = pfVar4[2] - fStack_460;
  fStack_45c = pfVar4[3] - 0.0;
  local_1b8 = local_4e8;
  fStack_1b4 = local_4e8;
  fStack_1b0 = local_4e8;
  fStack_1ac = local_4e8;
  local_138 = fStack_4e4;
  fStack_134 = fStack_4e4;
  fStack_130 = fStack_4e4;
  fStack_12c = fStack_4e4;
  local_148 = fStack_4e0;
  fStack_144 = fStack_4e0;
  fStack_140 = fStack_4e0;
  fStack_13c = fStack_4e0;
  local_1c8 = fStack_4dc;
  fStack_1c4 = fStack_4dc;
  fStack_1c0 = fStack_4dc;
  fStack_1bc = fStack_4dc;
  local_1d8 = local_448;
  fStack_1d4 = local_448;
  fStack_1d0 = local_448;
  fStack_1cc = local_448;
  local_1e8 = fStack_444;
  fStack_1e4 = fStack_444;
  fStack_1e0 = fStack_444;
  fStack_1dc = fStack_444;
  local_1f8 = fStack_440;
  fStack_1f4 = fStack_440;
  fStack_1f0 = fStack_440;
  fStack_1ec = fStack_440;
  local_208 = fStack_43c;
  fStack_204 = fStack_43c;
  fStack_200 = fStack_43c;
  fStack_1fc = fStack_43c;
  local_218 = fStack_454;
  fStack_214 = fStack_454;
  fStack_210 = fStack_454;
  fStack_20c = fStack_454;
  local_228 = fStack_450;
  fStack_224 = fStack_450;
  fStack_220 = fStack_450;
  fStack_21c = fStack_450;
  local_128 = fStack_11c + fVar102 + fVar101;
  fStack_124 = fStack_11c + fVar102 + fVar101;
  fStack_120 = fStack_11c + fVar102 + fVar101;
  fStack_11c = fStack_11c + fVar102 + fVar101;
  local_238 = fStack_44c;
  fStack_234 = fStack_44c;
  fStack_230 = fStack_44c;
  fStack_22c = fStack_44c;
  local_248 = fStack_464;
  fStack_244 = fStack_464;
  fStack_240 = fStack_464;
  fStack_23c = fStack_464;
  local_258 = fStack_460;
  fStack_254 = fStack_460;
  fStack_250 = fStack_460;
  fStack_24c = fStack_460;
  local_268 = fStack_45c;
  fStack_264 = fStack_45c;
  fStack_260 = fStack_45c;
  fStack_25c = fStack_45c;
  fStack_304 = local_308;
  fStack_300 = local_308;
  fStack_2fc = local_308;
  fStack_2f4 = local_2f8;
  fStack_2f0 = local_2f8;
  fStack_2ec = local_2f8;
  local_298 = ABS(local_128);
  fStack_294 = ABS(fStack_124);
  fStack_290 = ABS(fStack_120);
  fStack_28c = ABS(fStack_11c);
  lVar44 = 1;
  local_4b0 = (RTCFilterFunctionNArguments *)0x1;
  uVar45 = 0;
  bVar46 = 0;
  local_3f8 = 0.0;
  fStack_3f4 = 1.0;
  uStack_3f0 = 0;
  uStack_3ec = 0;
  local_278 = local_458;
  fStack_274 = local_458;
  fStack_270 = local_458;
  fStack_26c = local_458;
  local_288 = local_468;
  fStack_284 = local_468;
  fStack_280 = local_468;
  fStack_27c = local_468;
  fStack_4d4 = local_4d8;
  fStack_4d0 = local_4d8;
  fStack_4cc = local_4d8;
  fStack_4c4 = local_4c8;
  fStack_4c0 = local_4c8;
  fStack_4bc = local_4c8;
  do {
    local_3b8 = fStack_3f4 - local_3f8;
    fStack_3b4 = local_3b8;
    fStack_3b0 = local_3b8;
    fStack_3ac = local_3b8;
    local_3c8 = local_3f8;
    fStack_3c4 = local_3f8;
    fStack_3c0 = local_3f8;
    fStack_3bc = local_3f8;
    fVar120 = local_3b8 * 0.0 + local_3f8;
    fVar121 = local_3b8 * 0.33333334 + local_3f8;
    fVar122 = local_3b8 * 0.6666667 + local_3f8;
    fVar139 = local_3b8 * 1.0 + local_3f8;
    fVar234 = 1.0 - fVar120;
    fVar239 = 1.0 - fVar121;
    fVar240 = 1.0 - fVar122;
    fVar250 = 1.0 - fVar139;
    fVar140 = fVar120 * 3.0;
    fVar60 = fVar121 * 3.0;
    fVar101 = fVar122 * 3.0;
    fVar102 = fVar139 * 3.0;
    fVar197 = ((fVar234 * 3.0 + -5.0) * fVar234 * fVar234 + 2.0) * 0.5;
    fVar220 = ((fVar239 * 3.0 + -5.0) * fVar239 * fVar239 + 2.0) * 0.5;
    fVar242 = ((fVar240 * 3.0 + -5.0) * fVar240 * fVar240 + 2.0) * 0.5;
    fVar249 = ((fVar250 * 3.0 + -5.0) * fVar250 * fVar250 + 2.0) * 0.5;
    fVar141 = -fVar234 * fVar120 * fVar120 * 0.5;
    fVar157 = -fVar239 * fVar121 * fVar121 * 0.5;
    fVar221 = -fVar240 * fVar122 * fVar122 * 0.5;
    fVar232 = -fVar250 * fVar139 * fVar139 * 0.5;
    fVar251 = (fVar120 * fVar120 * (fVar140 + -5.0) + 2.0) * 0.5;
    fVar252 = (fVar121 * fVar121 * (fVar60 + -5.0) + 2.0) * 0.5;
    fVar253 = (fVar122 * fVar122 * (fVar101 + -5.0) + 2.0) * 0.5;
    fVar254 = (fVar139 * fVar139 * (fVar102 + -5.0) + 2.0) * 0.5;
    fVar103 = local_3b8 * 0.11111111;
    fVar156 = -fVar120 * fVar234 * fVar234 * 0.5;
    fVar158 = -fVar121 * fVar239 * fVar239 * 0.5;
    fVar222 = -fVar122 * fVar240 * fVar240 * 0.5;
    fVar233 = -fVar139 * fVar250 * fVar250 * 0.5;
    fVar260 = local_1b8 * fVar156 + local_1d8 * fVar251 + local_278 * fVar197 + local_288 * fVar141;
    fVar261 = fStack_1b4 * fVar158 +
              fStack_1d4 * fVar252 + fStack_274 * fVar220 + fStack_284 * fVar157;
    fVar262 = fStack_1b0 * fVar222 +
              fStack_1d0 * fVar253 + fStack_270 * fVar242 + fStack_280 * fVar221;
    fVar263 = fStack_1ac * fVar233 +
              fStack_1cc * fVar254 + fStack_26c * fVar249 + fStack_27c * fVar232;
    fVar175 = local_138 * fVar156 + local_1e8 * fVar251 + local_218 * fVar197 + local_248 * fVar141;
    fVar177 = fStack_134 * fVar158 +
              fStack_1e4 * fVar252 + fStack_214 * fVar220 + fStack_244 * fVar157;
    fVar184 = fStack_130 * fVar222 +
              fStack_1e0 * fVar253 + fStack_210 * fVar242 + fStack_240 * fVar221;
    fVar195 = fStack_12c * fVar233 +
              fStack_1dc * fVar254 + fStack_20c * fVar249 + fStack_23c * fVar232;
    fVar176 = local_148 * fVar156 + local_1f8 * fVar251 + local_228 * fVar197 + local_258 * fVar141;
    fVar183 = fStack_144 * fVar158 +
              fStack_1f4 * fVar252 + fStack_224 * fVar220 + fStack_254 * fVar157;
    fVar185 = fStack_140 * fVar222 +
              fStack_1f0 * fVar253 + fStack_220 * fVar242 + fStack_250 * fVar221;
    fVar196 = fStack_13c * fVar233 +
              fStack_1ec * fVar254 + fStack_21c * fVar249 + fStack_24c * fVar232;
    fVar197 = fVar156 * local_1c8 + fVar251 * local_208 + fVar197 * local_238 + fVar141 * local_268;
    fVar220 = fVar158 * fStack_1c4 +
              fVar252 * fStack_204 + fVar220 * fStack_234 + fVar157 * fStack_264;
    auVar179._0_8_ = CONCAT44(fVar220,fVar197);
    auVar179._8_4_ =
         fVar222 * fStack_1c0 + fVar253 * fStack_200 + fVar242 * fStack_230 + fVar221 * fStack_260;
    auVar179._12_4_ =
         fVar233 * fStack_1bc + fVar254 * fStack_1fc + fVar249 * fStack_22c + fVar232 * fStack_25c;
    fVar221 = fVar120 * (fVar234 + fVar234);
    fVar232 = fVar121 * (fVar239 + fVar239);
    fVar242 = fVar122 * (fVar240 + fVar240);
    fVar251 = fVar139 * (fVar250 + fVar250);
    fVar222 = (fVar221 - fVar234 * fVar234) * 0.5;
    fVar233 = (fVar232 - fVar239 * fVar239) * 0.5;
    fVar249 = (fVar242 - fVar240 * fVar240) * 0.5;
    fVar252 = (fVar251 - fVar250 * fVar250) * 0.5;
    fVar141 = (fVar120 * fVar140 + (fVar120 + fVar120) * (fVar140 + -5.0)) * 0.5;
    fVar156 = (fVar121 * fVar60 + (fVar121 + fVar121) * (fVar60 + -5.0)) * 0.5;
    fVar157 = (fVar122 * fVar101 + (fVar122 + fVar122) * (fVar101 + -5.0)) * 0.5;
    fVar158 = (fVar139 * fVar102 + (fVar139 + fVar139) * (fVar102 + -5.0)) * 0.5;
    fVar140 = ((fVar140 + 2.0) * (fVar234 + fVar234) - fVar234 * 3.0 * fVar234) * 0.5;
    fVar60 = ((fVar60 + 2.0) * (fVar239 + fVar239) - fVar239 * 3.0 * fVar239) * 0.5;
    fVar101 = ((fVar101 + 2.0) * (fVar240 + fVar240) - fVar240 * 3.0 * fVar240) * 0.5;
    fVar102 = ((fVar102 + 2.0) * (fVar250 + fVar250) - fVar250 * 3.0 * fVar250) * 0.5;
    fVar120 = (fVar120 * fVar120 - fVar221) * 0.5;
    fVar121 = (fVar121 * fVar121 - fVar232) * 0.5;
    fVar122 = (fVar122 * fVar122 - fVar242) * 0.5;
    fVar139 = (fVar139 * fVar139 - fVar251) * 0.5;
    local_388 = (local_1b8 * fVar222 +
                local_1d8 * fVar141 + local_278 * fVar140 + local_288 * fVar120) * fVar103;
    local_568 = (fStack_1b4 * fVar233 +
                fStack_1d4 * fVar156 + fStack_274 * fVar60 + fStack_284 * fVar121) * fVar103;
    fStack_564 = (fStack_1b0 * fVar249 +
                 fStack_1d0 * fVar157 + fStack_270 * fVar101 + fStack_280 * fVar122) * fVar103;
    fStack_560 = (fStack_1ac * fVar252 +
                 fStack_1cc * fVar158 + fStack_26c * fVar102 + fStack_27c * fVar139) * fVar103;
    local_5a8._0_4_ =
         (local_138 * fVar222 + local_1e8 * fVar141 + local_218 * fVar140 + local_248 * fVar120) *
         fVar103;
    local_5a8._4_4_ =
         (fStack_134 * fVar233 + fStack_1e4 * fVar156 + fStack_214 * fVar60 + fStack_244 * fVar121)
         * fVar103;
    fStack_5a0 = (fStack_130 * fVar249 +
                 fStack_1e0 * fVar157 + fStack_210 * fVar101 + fStack_240 * fVar122) * fVar103;
    fStack_59c = (fStack_12c * fVar252 +
                 fStack_1dc * fVar158 + fStack_20c * fVar102 + fStack_23c * fVar139) * fVar103;
    local_5b8 = (local_148 * fVar222 +
                local_1f8 * fVar141 + local_228 * fVar140 + local_258 * fVar120) * fVar103;
    fStack_5b4 = (fStack_144 * fVar233 +
                 fStack_1f4 * fVar156 + fStack_224 * fVar60 + fStack_254 * fVar121) * fVar103;
    fStack_5b0 = (fStack_140 * fVar249 +
                 fStack_1f0 * fVar157 + fStack_220 * fVar101 + fStack_250 * fVar122) * fVar103;
    fStack_5ac = (fStack_13c * fVar252 +
                 fStack_1ec * fVar158 + fStack_21c * fVar102 + fStack_24c * fVar139) * fVar103;
    fVar60 = fVar103 * (fVar233 * fStack_1c4 +
                       fVar156 * fStack_204 + fVar60 * fStack_234 + fVar121 * fStack_264);
    fVar101 = fVar103 * (fVar249 * fStack_1c0 +
                        fVar157 * fStack_200 + fVar101 * fStack_230 + fVar122 * fStack_260);
    fVar102 = fVar103 * (fVar252 * fStack_1bc +
                        fVar158 * fStack_1fc + fVar102 * fStack_22c + fVar139 * fStack_25c);
    auVar268._4_4_ = auVar179._8_4_;
    auVar268._0_4_ = fVar220;
    auVar268._8_4_ = auVar179._12_4_;
    auVar268._12_4_ = 0;
    local_598._4_4_ = fVar220 + fVar60;
    local_598._0_4_ =
         fVar197 + fVar103 * (fVar222 * local_1c8 +
                             fVar141 * local_208 + fVar140 * local_238 + fVar120 * local_268);
    fStack_590 = auVar179._8_4_ + fVar101;
    fStack_58c = auVar179._12_4_ + fVar102;
    auVar226._0_8_ = CONCAT44(auVar179._8_4_ - fVar101,fVar220 - fVar60);
    auVar226._8_4_ = auVar179._12_4_ - fVar102;
    auVar226._12_4_ = 0;
    local_408._0_4_ = fVar177 - fVar175;
    local_408._4_4_ = fVar184 - fVar177;
    fStack_400 = fVar195 - fVar184;
    fStack_3fc = 0.0 - fVar195;
    fVar103 = fVar183 - fVar176;
    fVar120 = fVar185 - fVar183;
    fVar121 = fVar196 - fVar185;
    fVar122 = 0.0 - fVar196;
    fVar140 = (float)local_5a8._0_4_ * fVar103 - local_5b8 * (float)local_408._0_4_;
    fVar60 = (float)local_5a8._4_4_ * fVar120 - fStack_5b4 * (float)local_408._4_4_;
    fVar101 = fStack_5a0 * fVar121 - fStack_5b0 * fStack_400;
    fVar102 = fStack_59c * fVar122 - fStack_5ac * fStack_3fc;
    local_588 = fVar261 - fVar260;
    fStack_584 = fVar262 - fVar261;
    fStack_580 = fVar263 - fVar262;
    fStack_57c = 0.0 - fVar263;
    fVar158 = local_5b8 * local_588 - local_388 * fVar103;
    fVar197 = fStack_5b4 * fStack_584 - local_568 * fVar120;
    fVar220 = fStack_5b0 * fStack_580 - fStack_564 * fVar121;
    fVar221 = fStack_5ac * fStack_57c - fStack_560 * fVar122;
    fVar222 = local_388 * (float)local_408._0_4_ - (float)local_5a8._0_4_ * local_588;
    fVar232 = local_568 * (float)local_408._4_4_ - (float)local_5a8._4_4_ * fStack_584;
    fVar233 = fStack_564 * fStack_400 - fStack_5a0 * fStack_580;
    fVar234 = fStack_560 * fStack_3fc - fStack_59c * fStack_57c;
    auVar212._0_4_ = (float)local_408._0_4_ * (float)local_408._0_4_ + fVar103 * fVar103;
    auVar212._4_4_ = (float)local_408._4_4_ * (float)local_408._4_4_ + fVar120 * fVar120;
    auVar212._8_4_ = fStack_400 * fStack_400 + fVar121 * fVar121;
    auVar212._12_4_ = fStack_3fc * fStack_3fc + fVar122 * fVar122;
    auVar235._0_4_ = local_588 * local_588 + auVar212._0_4_;
    auVar235._4_4_ = fStack_584 * fStack_584 + auVar212._4_4_;
    auVar235._8_4_ = fStack_580 * fStack_580 + auVar212._8_4_;
    auVar235._12_4_ = fStack_57c * fStack_57c + auVar212._12_4_;
    auVar70 = rcpps(auVar212,auVar235);
    fVar139 = auVar70._0_4_;
    fVar141 = auVar70._4_4_;
    fVar156 = auVar70._8_4_;
    fVar157 = auVar70._12_4_;
    fVar139 = (1.0 - fVar139 * auVar235._0_4_) * fVar139 + fVar139;
    fVar141 = (1.0 - fVar141 * auVar235._4_4_) * fVar141 + fVar141;
    fVar156 = (1.0 - fVar156 * auVar235._8_4_) * fVar156 + fVar156;
    fVar157 = (1.0 - fVar157 * auVar235._12_4_) * fVar157 + fVar157;
    auVar110._4_4_ = local_5a8._4_4_;
    auVar110._0_4_ = local_5a8._0_4_;
    auVar110._8_4_ = fStack_5a0;
    auVar110._12_4_ = fStack_59c;
    _local_528 = auVar110 >> 0x20;
    fVar239 = fVar103 * (float)local_5a8._4_4_ - (float)local_408._0_4_ * fStack_5b4;
    fVar240 = fVar120 * fStack_5a0 - (float)local_408._4_4_ * fStack_5b0;
    fVar242 = fVar121 * fStack_59c - fStack_400 * fStack_5ac;
    fVar249 = fVar122 * 0.0 - fStack_3fc * 0.0;
    fStack_384 = local_568;
    fStack_380 = fStack_564;
    fStack_37c = fStack_560;
    local_538._4_4_ = fStack_5b0;
    local_538._0_4_ = fStack_5b4;
    fStack_530 = fStack_5ac;
    fStack_52c = 0.0;
    fVar250 = local_588 * fStack_5b4 - fVar103 * local_568;
    fVar251 = fStack_584 * fStack_5b0 - fVar120 * fStack_564;
    fVar252 = fStack_580 * fStack_5ac - fVar121 * fStack_560;
    fVar253 = fStack_57c * 0.0 - fVar122 * 0.0;
    fStack_55c = 0.0;
    fVar254 = (float)local_408._0_4_ * local_568 - local_588 * (float)local_5a8._4_4_;
    fVar255 = (float)local_408._4_4_ * fStack_564 - fStack_584 * fStack_5a0;
    fVar258 = fStack_400 * fStack_560 - fStack_580 * fStack_59c;
    fVar259 = fStack_3fc * 0.0 - fStack_57c * 0.0;
    auVar125._0_4_ = (fVar140 * fVar140 + fVar158 * fVar158 + fVar222 * fVar222) * fVar139;
    auVar125._4_4_ = (fVar60 * fVar60 + fVar197 * fVar197 + fVar232 * fVar232) * fVar141;
    auVar125._8_4_ = (fVar101 * fVar101 + fVar220 * fVar220 + fVar233 * fVar233) * fVar156;
    auVar125._12_4_ = (fVar102 * fVar102 + fVar221 * fVar221 + fVar234 * fVar234) * fVar157;
    auVar243._0_4_ = (fVar239 * fVar239 + fVar250 * fVar250 + fVar254 * fVar254) * fVar139;
    auVar243._4_4_ = (fVar240 * fVar240 + fVar251 * fVar251 + fVar255 * fVar255) * fVar141;
    auVar243._8_4_ = (fVar242 * fVar242 + fVar252 * fVar252 + fVar258 * fVar258) * fVar156;
    auVar243._12_4_ = (fVar249 * fVar249 + fVar253 * fVar253 + fVar259 * fVar259) * fVar157;
    auVar70 = maxps(auVar125,auVar243);
    auVar213._8_4_ = auVar179._8_4_;
    auVar213._0_8_ = auVar179._0_8_;
    auVar213._12_4_ = auVar179._12_4_;
    auVar214 = maxps(auVar213,_local_598);
    auVar162._8_4_ = auVar226._8_4_;
    auVar162._0_8_ = auVar226._0_8_;
    auVar162._12_4_ = 0;
    auVar225 = maxps(auVar162,auVar268);
    auVar215 = maxps(auVar214,auVar225);
    auVar225 = minps(auVar179,_local_598);
    auVar214 = minps(auVar226,auVar268);
    auVar214 = minps(auVar225,auVar214);
    auVar70 = sqrtps(_local_528,auVar70);
    auVar225 = rsqrtps(auVar70,auVar235);
    fVar140 = auVar225._0_4_;
    fVar60 = auVar225._4_4_;
    fVar101 = auVar225._8_4_;
    fVar102 = auVar225._12_4_;
    fVar140 = fVar140 * 1.5 - fVar140 * fVar140 * auVar235._0_4_ * 0.5 * fVar140;
    fVar60 = fVar60 * 1.5 - fVar60 * fVar60 * auVar235._4_4_ * 0.5 * fVar60;
    fVar101 = fVar101 * 1.5 - fVar101 * fVar101 * auVar235._8_4_ * 0.5 * fVar101;
    fVar102 = fVar102 * 1.5 - fVar102 * fVar102 * auVar235._12_4_ * 0.5 * fVar102;
    local_398 = 0.0 - fVar175;
    fStack_394 = 0.0 - fVar177;
    fStack_390 = 0.0 - fVar184;
    fStack_38c = 0.0 - fVar195;
    local_3a8 = 0.0 - fVar176;
    fStack_3a4 = 0.0 - fVar183;
    fStack_3a0 = 0.0 - fVar185;
    fStack_39c = 0.0 - fVar196;
    fVar158 = 0.0 - fVar260;
    fVar197 = 0.0 - fVar261;
    fVar220 = 0.0 - fVar262;
    fVar221 = 0.0 - fVar263;
    auVar264._8_4_ = fVar101;
    auVar264._0_8_ = CONCAT44(fVar60,fVar140);
    auVar264._12_4_ = fVar102;
    local_318._0_4_ =
         local_308 * local_588 * fVar140 +
         local_4d8 * (float)local_408._0_4_ * fVar140 + local_2f8 * fVar103 * fVar140;
    local_318._4_4_ =
         fStack_304 * fStack_584 * fVar60 +
         fStack_4d4 * (float)local_408._4_4_ * fVar60 + fStack_2f4 * fVar120 * fVar60;
    fStack_310 = fStack_300 * fStack_580 * fVar101 +
                 fStack_4d0 * fStack_400 * fVar101 + fStack_2f0 * fVar121 * fVar101;
    fStack_30c = fStack_2fc * fStack_57c * fVar102 +
                 fStack_4cc * fStack_3fc * fVar102 + fStack_2ec * fVar122 * fVar102;
    local_328._0_4_ =
         local_588 * fVar140 * fVar158 +
         (float)local_408._0_4_ * fVar140 * local_398 + fVar103 * fVar140 * local_3a8;
    local_328._4_4_ =
         fStack_584 * fVar60 * fVar197 +
         (float)local_408._4_4_ * fVar60 * fStack_394 + fVar120 * fVar60 * fStack_3a4;
    fStack_320 = fStack_580 * fVar101 * fVar220 +
                 fStack_400 * fVar101 * fStack_390 + fVar121 * fVar101 * fStack_3a0;
    fStack_31c = fStack_57c * fVar102 * fVar221 +
                 fStack_3fc * fVar102 * fStack_38c + fVar122 * fVar102 * fStack_39c;
    local_178 = (local_308 * fVar158 + local_4d8 * local_398 + local_2f8 * local_3a8) -
                (float)local_318._0_4_ * (float)local_328._0_4_;
    fStack_174 = (fStack_304 * fVar197 + fStack_4d4 * fStack_394 + fStack_2f4 * fStack_3a4) -
                 (float)local_318._4_4_ * (float)local_328._4_4_;
    fStack_170 = (fStack_300 * fVar220 + fStack_4d0 * fStack_390 + fStack_2f0 * fStack_3a0) -
                 fStack_310 * fStack_320;
    fStack_16c = (fStack_2fc * fVar221 + fStack_4cc * fStack_38c + fStack_2ec * fStack_39c) -
                 fStack_30c * fStack_31c;
    local_578._0_4_ =
         (fVar158 * fVar158 + local_398 * local_398 + local_3a8 * local_3a8) -
         (float)local_328._0_4_ * (float)local_328._0_4_;
    local_578._4_4_ =
         (fVar197 * fVar197 + fStack_394 * fStack_394 + fStack_3a4 * fStack_3a4) -
         (float)local_328._4_4_ * (float)local_328._4_4_;
    fStack_570 = (fVar220 * fVar220 + fStack_390 * fStack_390 + fStack_3a0 * fStack_3a0) -
                 fStack_320 * fStack_320;
    fStack_56c = (fVar221 * fVar221 + fStack_38c * fStack_38c + fStack_39c * fStack_39c) -
                 fStack_31c * fStack_31c;
    fVar139 = (auVar215._0_4_ + auVar70._0_4_) * 1.0000002;
    fVar141 = (auVar215._4_4_ + auVar70._4_4_) * 1.0000002;
    fVar156 = (auVar215._8_4_ + auVar70._8_4_) * 1.0000002;
    fVar157 = (auVar215._12_4_ + auVar70._12_4_) * 1.0000002;
    auVar227._0_4_ = (float)local_578._0_4_ - fVar139 * fVar139;
    auVar227._4_4_ = (float)local_578._4_4_ - fVar141 * fVar141;
    auVar227._8_4_ = fStack_570 - fVar156 * fVar156;
    auVar227._12_4_ = fStack_56c - fVar157 * fVar157;
    local_168 = (float)local_318._0_4_ * (float)local_318._0_4_;
    fStack_164 = (float)local_318._4_4_ * (float)local_318._4_4_;
    fStack_160 = fStack_310 * fStack_310;
    fStack_15c = fStack_30c * fStack_30c;
    local_368 = local_128 - local_168;
    fStack_364 = fStack_124 - fStack_164;
    fStack_360 = fStack_120 - fStack_160;
    fStack_35c = fStack_11c - fStack_15c;
    local_178 = local_178 + local_178;
    fStack_174 = fStack_174 + fStack_174;
    fStack_170 = fStack_170 + fStack_170;
    fStack_16c = fStack_16c + fStack_16c;
    local_3e8 = local_178 * local_178;
    fStack_3e4 = fStack_174 * fStack_174;
    fStack_3e0 = fStack_170 * fStack_170;
    fStack_3dc = fStack_16c * fStack_16c;
    auVar216._0_4_ = local_3e8 - local_368 * 4.0 * auVar227._0_4_;
    auVar216._4_4_ = fStack_3e4 - fStack_364 * 4.0 * auVar227._4_4_;
    auVar216._8_4_ = fStack_3e0 - fStack_360 * 4.0 * auVar227._8_4_;
    auVar216._12_4_ = fStack_3dc - fStack_35c * 4.0 * auVar227._12_4_;
    local_4f8._4_4_ = (auVar214._4_4_ - auVar70._4_4_) * 0.99999976;
    local_4f8._0_4_ = (auVar214._0_4_ - auVar70._0_4_) * 0.99999976;
    fStack_4f0 = (auVar214._8_4_ - auVar70._8_4_) * 0.99999976;
    fStack_4ec = (auVar214._12_4_ - auVar70._12_4_) * 0.99999976;
    auVar236._4_4_ = -(uint)(0.0 <= auVar216._4_4_);
    auVar236._0_4_ = -(uint)(0.0 <= auVar216._0_4_);
    auVar236._8_4_ = -(uint)(0.0 <= auVar216._8_4_);
    auVar236._12_4_ = -(uint)(0.0 <= auVar216._12_4_);
    uVar48 = (undefined4)((ulong)lVar44 >> 0x20);
    iVar41 = movmskps((int)lVar44,auVar236);
    if (iVar41 == 0) {
      iVar41 = 0;
      auVar164 = _DAT_01feb9f0;
      auVar244 = _DAT_01feba00;
    }
    else {
      auVar225 = sqrtps(auVar264,auVar216);
      bVar9 = 0.0 <= auVar216._0_4_;
      uVar55 = -(uint)bVar9;
      bVar10 = 0.0 <= auVar216._4_4_;
      uVar56 = -(uint)bVar10;
      bVar11 = 0.0 <= auVar216._8_4_;
      uVar57 = -(uint)bVar11;
      bVar12 = 0.0 <= auVar216._12_4_;
      uVar58 = -(uint)bVar12;
      auVar163._0_4_ = local_368 + local_368;
      auVar163._4_4_ = fStack_364 + fStack_364;
      auVar163._8_4_ = fStack_360 + fStack_360;
      auVar163._12_4_ = fStack_35c + fStack_35c;
      auVar70 = rcpps(auVar227,auVar163);
      fVar139 = auVar70._0_4_;
      fVar156 = auVar70._4_4_;
      fVar222 = auVar70._8_4_;
      fVar233 = auVar70._12_4_;
      fVar139 = (1.0 - auVar163._0_4_ * fVar139) * fVar139 + fVar139;
      fVar156 = (1.0 - auVar163._4_4_ * fVar156) * fVar156 + fVar156;
      fVar222 = (1.0 - auVar163._8_4_ * fVar222) * fVar222 + fVar222;
      fVar233 = (1.0 - auVar163._12_4_ * fVar233) * fVar233 + fVar233;
      fVar141 = (-local_178 - auVar225._0_4_) * fVar139;
      fVar157 = (-fStack_174 - auVar225._4_4_) * fVar156;
      fVar232 = (-fStack_170 - auVar225._8_4_) * fVar222;
      fVar234 = (-fStack_16c - auVar225._12_4_) * fVar233;
      fVar139 = (auVar225._0_4_ - local_178) * fVar139;
      fVar156 = (auVar225._4_4_ - fStack_174) * fVar156;
      fVar222 = (auVar225._8_4_ - fStack_170) * fVar222;
      fVar233 = (auVar225._12_4_ - fStack_16c) * fVar233;
      local_2c8._4_4_ = ((float)local_318._4_4_ * fVar157 + (float)local_328._4_4_) * fVar60;
      local_2c8._0_4_ = ((float)local_318._0_4_ * fVar141 + (float)local_328._0_4_) * fVar140;
      fStack_2c0 = (fStack_310 * fVar232 + fStack_320) * fVar101;
      fStack_2bc = (fStack_30c * fVar234 + fStack_31c) * fVar102;
      local_2d8[0] = ((float)local_318._0_4_ * fVar139 + (float)local_328._0_4_) * fVar140;
      local_2d8[1] = ((float)local_318._4_4_ * fVar156 + (float)local_328._4_4_) * fVar60;
      local_2d8[2] = (fStack_310 * fVar222 + fStack_320) * fVar101;
      local_2d8[3] = (fStack_30c * fVar233 + fStack_31c) * fVar102;
      auVar228._0_4_ = (uint)fVar141 & uVar55;
      auVar228._4_4_ = (uint)fVar157 & uVar56;
      auVar228._8_4_ = (uint)fVar232 & uVar57;
      auVar228._12_4_ = (uint)fVar234 & uVar58;
      auVar164._0_8_ = CONCAT44(~uVar56,~uVar55) & 0x7f8000007f800000;
      auVar164._8_4_ = ~uVar57 & 0x7f800000;
      auVar164._12_4_ = ~uVar58 & 0x7f800000;
      auVar164 = auVar164 | auVar228;
      auVar265._0_4_ = (uint)fVar139 & uVar55;
      auVar265._4_4_ = (uint)fVar156 & uVar56;
      auVar265._8_4_ = (uint)fVar222 & uVar57;
      auVar265._12_4_ = (uint)fVar233 & uVar58;
      auVar244._0_8_ = CONCAT44(~uVar56,~uVar55) & 0xff800000ff800000;
      auVar244._8_4_ = ~uVar57 & 0xff800000;
      auVar244._12_4_ = ~uVar58 & 0xff800000;
      auVar244 = auVar244 | auVar265;
      auVar229._0_8_ = CONCAT44(fStack_164,local_168) & 0x7fffffff7fffffff;
      auVar229._8_4_ = ABS(fStack_160);
      auVar229._12_4_ = ABS(fStack_15c);
      auVar23._4_4_ = fStack_294;
      auVar23._0_4_ = local_298;
      auVar23._8_4_ = fStack_290;
      auVar23._12_4_ = fStack_28c;
      auVar70 = maxps(auVar23,auVar229);
      fVar139 = auVar70._0_4_ * 1.9073486e-06;
      fVar141 = auVar70._4_4_ * 1.9073486e-06;
      fVar156 = auVar70._8_4_ * 1.9073486e-06;
      fVar157 = auVar70._12_4_ * 1.9073486e-06;
      auVar266._0_4_ = -(uint)(ABS(local_368) < fVar139 && bVar9);
      auVar266._4_4_ = -(uint)(ABS(fStack_364) < fVar141 && bVar10);
      auVar266._8_4_ = -(uint)(ABS(fStack_360) < fVar156 && bVar11);
      auVar266._12_4_ = -(uint)(ABS(fStack_35c) < fVar157 && bVar12);
      iVar41 = movmskps(iVar41,auVar266);
      if (iVar41 != 0) {
        uVar55 = -(uint)(auVar227._0_4_ <= 0.0);
        uVar56 = -(uint)(auVar227._4_4_ <= 0.0);
        uVar57 = -(uint)(auVar227._8_4_ <= 0.0);
        uVar58 = -(uint)(auVar227._12_4_ <= 0.0);
        auVar257._0_4_ = (uVar55 & 0xff800000 | ~uVar55 & 0x7f800000) & auVar266._0_4_;
        auVar257._4_4_ = (uVar56 & 0xff800000 | ~uVar56 & 0x7f800000) & auVar266._4_4_;
        auVar257._8_4_ = (uVar57 & 0xff800000 | ~uVar57 & 0x7f800000) & auVar266._8_4_;
        auVar257._12_4_ = (uVar58 & 0xff800000 | ~uVar58 & 0x7f800000) & auVar266._12_4_;
        auVar182._0_4_ = ~auVar266._0_4_ & auVar164._0_4_;
        auVar182._4_4_ = ~auVar266._4_4_ & auVar164._4_4_;
        auVar182._8_4_ = ~auVar266._8_4_ & auVar164._8_4_;
        auVar182._12_4_ = ~auVar266._12_4_ & auVar164._12_4_;
        auVar164 = auVar182 | auVar257;
        auVar174._0_4_ = (uVar55 & 0x7f800000 | ~uVar55 & 0xff800000) & auVar266._0_4_;
        auVar174._4_4_ = (uVar56 & 0x7f800000 | ~uVar56 & 0xff800000) & auVar266._4_4_;
        auVar174._8_4_ = (uVar57 & 0x7f800000 | ~uVar57 & 0xff800000) & auVar266._8_4_;
        auVar174._12_4_ = (uVar58 & 0x7f800000 | ~uVar58 & 0xff800000) & auVar266._12_4_;
        auVar267._0_4_ = ~auVar266._0_4_ & auVar244._0_4_;
        auVar267._4_4_ = ~auVar266._4_4_ & auVar244._4_4_;
        auVar267._8_4_ = ~auVar266._8_4_ & auVar244._8_4_;
        auVar267._12_4_ = ~auVar266._12_4_ & auVar244._12_4_;
        auVar244 = auVar267 | auVar174;
        auVar236._0_4_ = -(uint)((fVar139 <= ABS(local_368) || auVar227._0_4_ <= 0.0) && bVar9);
        auVar236._4_4_ = -(uint)((fVar141 <= ABS(fStack_364) || auVar227._4_4_ <= 0.0) && bVar10);
        auVar236._8_4_ = -(uint)((fVar156 <= ABS(fStack_360) || auVar227._8_4_ <= 0.0) && bVar11);
        auVar236._12_4_ = -(uint)((fVar157 <= ABS(fStack_35c) || auVar227._12_4_ <= 0.0) && bVar12);
      }
    }
    local_2a8._8_4_ = fVar101;
    local_2a8._0_8_ = CONCAT44(fVar60,fVar140);
    local_2a8._12_4_ = fVar102;
    auVar237._0_4_ = (auVar236._0_4_ << 0x1f) >> 0x1f;
    auVar237._4_4_ = (auVar236._4_4_ << 0x1f) >> 0x1f;
    auVar237._8_4_ = (auVar236._8_4_ << 0x1f) >> 0x1f;
    auVar237._12_4_ = (auVar236._12_4_ << 0x1f) >> 0x1f;
    auVar237 = auVar237 & local_158;
    iVar41 = movmskps(iVar41,auVar237);
    if (iVar41 == 0) {
LAB_00b590f2:
      lVar44 = CONCAT44(uVar48,iVar41);
    }
    else {
      auVar269._0_4_ = (ray->org).field_0.m128[3] - (float)local_2e8._0_4_;
      auVar269._4_4_ = auVar269._0_4_;
      auVar269._8_4_ = auVar269._0_4_;
      auVar269._12_4_ = auVar269._0_4_;
      auVar214 = maxps(auVar269,auVar164);
      auVar145._0_4_ = ray->tfar - (float)local_2e8._0_4_;
      auVar145._4_4_ = auVar145._0_4_;
      auVar145._8_4_ = auVar145._0_4_;
      auVar145._12_4_ = auVar145._0_4_;
      auVar225 = minps(auVar145,auVar244);
      auVar84._0_4_ = (float)local_5a8._0_4_ * local_4d8 + local_5b8 * local_2f8;
      auVar84._4_4_ = (float)local_5a8._4_4_ * fStack_4d4 + fStack_5b4 * fStack_2f4;
      auVar84._8_4_ = fStack_5a0 * fStack_4d0 + fStack_5b0 * fStack_2f0;
      auVar84._12_4_ = fStack_59c * fStack_4cc + fStack_5ac * fStack_2ec;
      auVar180._0_4_ = local_388 * local_308 + auVar84._0_4_;
      auVar180._4_4_ = local_568 * fStack_304 + auVar84._4_4_;
      auVar180._8_4_ = fStack_564 * fStack_300 + auVar84._8_4_;
      auVar180._12_4_ = fStack_560 * fStack_2fc + auVar84._12_4_;
      auVar70 = rcpps(auVar84,auVar180);
      fVar139 = auVar70._0_4_;
      fVar141 = auVar70._4_4_;
      fVar156 = auVar70._8_4_;
      fVar157 = auVar70._12_4_;
      fVar139 = ((1.0 - auVar180._0_4_ * fVar139) * fVar139 + fVar139) *
                -(fVar158 * local_388 + local_398 * (float)local_5a8._0_4_ + local_3a8 * local_5b8);
      fVar141 = ((1.0 - auVar180._4_4_ * fVar141) * fVar141 + fVar141) *
                -(fVar197 * local_568 +
                 fStack_394 * (float)local_5a8._4_4_ + fStack_3a4 * fStack_5b4);
      fVar156 = ((1.0 - auVar180._8_4_ * fVar156) * fVar156 + fVar156) *
                -(fVar220 * fStack_564 + fStack_390 * fStack_5a0 + fStack_3a0 * fStack_5b0);
      fVar157 = ((1.0 - auVar180._12_4_ * fVar157) * fVar157 + fVar157) *
                -(fVar221 * fStack_560 + fStack_38c * fStack_59c + fStack_39c * fStack_5ac);
      auVar230._0_12_ = ZEXT812(0);
      auVar230._12_4_ = 0;
      uVar55 = -(uint)(auVar180._0_4_ < 0.0 || ABS(auVar180._0_4_) < 1e-18);
      uVar56 = -(uint)(auVar180._4_4_ < 0.0 || ABS(auVar180._4_4_) < 1e-18);
      uVar57 = -(uint)(auVar180._8_4_ < 0.0 || ABS(auVar180._8_4_) < 1e-18);
      uVar58 = -(uint)(auVar180._12_4_ < 0.0 || ABS(auVar180._12_4_) < 1e-18);
      auVar165._0_8_ = CONCAT44(uVar56,uVar55) & 0xff800000ff800000;
      auVar165._8_4_ = uVar57 & 0xff800000;
      auVar165._12_4_ = uVar58 & 0xff800000;
      auVar85._0_4_ = ~uVar55 & (uint)fVar139;
      auVar85._4_4_ = ~uVar56 & (uint)fVar141;
      auVar85._8_4_ = ~uVar57 & (uint)fVar156;
      auVar85._12_4_ = ~uVar58 & (uint)fVar157;
      auVar214 = maxps(auVar214,auVar85 | auVar165);
      uVar55 = -(uint)(0.0 < auVar180._0_4_ || ABS(auVar180._0_4_) < 1e-18);
      uVar56 = -(uint)(0.0 < auVar180._4_4_ || ABS(auVar180._4_4_) < 1e-18);
      uVar57 = -(uint)(0.0 < auVar180._8_4_ || ABS(auVar180._8_4_) < 1e-18);
      uVar58 = -(uint)(0.0 < auVar180._12_4_ || ABS(auVar180._12_4_) < 1e-18);
      auVar86._0_8_ = CONCAT44(uVar56,uVar55) & 0x7f8000007f800000;
      auVar86._8_4_ = uVar57 & 0x7f800000;
      auVar86._12_4_ = uVar58 & 0x7f800000;
      auVar181._0_4_ = ~uVar55 & (uint)fVar139;
      auVar181._4_4_ = ~uVar56 & (uint)fVar141;
      auVar181._8_4_ = ~uVar57 & (uint)fVar156;
      auVar181._12_4_ = ~uVar58 & (uint)fVar157;
      auVar225 = minps(auVar225,auVar181 | auVar86);
      auVar111._0_4_ = (0.0 - fVar177) * -(float)local_5a8._4_4_ + (0.0 - fVar183) * -fStack_5b4;
      auVar111._4_4_ = (0.0 - fVar184) * -fStack_5a0 + (0.0 - fVar185) * -fStack_5b0;
      auVar111._8_4_ = (0.0 - fVar195) * -fStack_59c + (0.0 - fVar196) * -fStack_5ac;
      auVar111._12_4_ = 0x80000000;
      auVar126._0_4_ =
           -local_568 * local_308 + -(float)local_5a8._4_4_ * local_4d8 + -fStack_5b4 * local_2f8;
      auVar126._4_4_ =
           -fStack_564 * fStack_304 + -fStack_5a0 * fStack_4d4 + -fStack_5b0 * fStack_2f4;
      auVar126._8_4_ =
           -fStack_560 * fStack_300 + -fStack_59c * fStack_4d0 + -fStack_5ac * fStack_2f0;
      auVar126._12_4_ = fStack_2fc * -0.0 + fStack_4cc * -0.0 + fStack_2ec * -0.0;
      auVar70 = rcpps(auVar111,auVar126);
      fVar139 = auVar70._0_4_;
      fVar141 = auVar70._4_4_;
      fVar156 = auVar70._8_4_;
      fVar157 = auVar70._12_4_;
      fVar139 = (((float)DAT_01feca10 - auVar126._0_4_ * fVar139) * fVar139 + fVar139) *
                -((0.0 - fVar261) * -local_568 + auVar111._0_4_);
      fVar141 = ((DAT_01feca10._4_4_ - auVar126._4_4_ * fVar141) * fVar141 + fVar141) *
                -((0.0 - fVar262) * -fStack_564 + auVar111._4_4_);
      fVar156 = ((DAT_01feca10._8_4_ - auVar126._8_4_ * fVar156) * fVar156 + fVar156) *
                -((0.0 - fVar263) * -fStack_560 + auVar111._8_4_);
      fVar157 = ((DAT_01feca10._12_4_ - auVar126._12_4_ * fVar157) * fVar157 + fVar157) * 0.0;
      uVar55 = -(uint)(auVar126._0_4_ < 0.0 || ABS(auVar126._0_4_) < 1e-18);
      uVar56 = -(uint)(auVar126._4_4_ < 0.0 || ABS(auVar126._4_4_) < 1e-18);
      uVar57 = -(uint)(auVar126._8_4_ < 0.0 || ABS(auVar126._8_4_) < 1e-18);
      uVar58 = -(uint)(auVar126._12_4_ < 0.0 || ABS(auVar126._12_4_) < 1e-18);
      auVar112._0_8_ = CONCAT44(uVar56,uVar55) & 0xff800000ff800000;
      auVar112._8_4_ = uVar57 & 0xff800000;
      auVar112._12_4_ = uVar58 & 0xff800000;
      auVar87._0_4_ = ~uVar55 & (uint)fVar139;
      auVar87._4_4_ = ~uVar56 & (uint)fVar141;
      auVar87._8_4_ = ~uVar57 & (uint)fVar156;
      auVar87._12_4_ = ~uVar58 & (uint)fVar157;
      local_3d8 = maxps(auVar214,auVar87 | auVar112);
      uVar55 = -(uint)(0.0 < auVar126._0_4_ || ABS(auVar126._0_4_) < 1e-18);
      uVar56 = -(uint)(0.0 < auVar126._4_4_ || ABS(auVar126._4_4_) < 1e-18);
      uVar57 = -(uint)(0.0 < auVar126._8_4_ || ABS(auVar126._8_4_) < 1e-18);
      uVar58 = -(uint)(0.0 < auVar126._12_4_ || ABS(auVar126._12_4_) < 1e-18);
      auVar88._0_8_ = CONCAT44(uVar56,uVar55) & 0x7f8000007f800000;
      auVar88._8_4_ = uVar57 & 0x7f800000;
      auVar88._12_4_ = uVar58 & 0x7f800000;
      auVar127._0_4_ = ~uVar55 & (uint)fVar139;
      auVar127._4_4_ = ~uVar56 & (uint)fVar141;
      auVar127._8_4_ = ~uVar57 & (uint)fVar156;
      auVar127._12_4_ = ~uVar58 & (uint)fVar157;
      _local_598 = minps(auVar225,auVar127 | auVar88);
      fVar139 = local_3d8._0_4_;
      fVar141 = local_3d8._4_4_;
      fVar156 = local_3d8._8_4_;
      fVar157 = local_3d8._12_4_;
      auVar270._0_4_ = -(uint)(fVar139 <= local_598._0_4_) & auVar237._0_4_;
      auVar270._4_4_ = -(uint)(fVar141 <= local_598._4_4_) & auVar237._4_4_;
      auVar270._8_4_ = -(uint)(fVar156 <= local_598._8_4_) & auVar237._8_4_;
      auVar270._12_4_ = -(uint)(fVar157 <= local_598._12_4_) & auVar237._12_4_;
      iVar41 = movmskps(iVar41,auVar270);
      if (iVar41 == 0) goto LAB_00b590f2;
      auVar70 = maxps(ZEXT816(0),_local_4f8);
      auVar225 = minps(_local_2c8,_DAT_01feca10);
      auVar193._0_12_ = ZEXT812(0);
      auVar193._12_4_ = 0;
      auVar225 = maxps(auVar225,auVar193);
      auVar22._4_4_ = local_2d8[1];
      auVar22._0_4_ = local_2d8[0];
      auVar22._8_4_ = local_2d8[2];
      auVar22._12_4_ = local_2d8[3];
      auVar214 = minps(auVar22,_DAT_01feca10);
      auVar214 = maxps(auVar214,auVar193);
      local_2c8._0_4_ = (auVar225._0_4_ + 0.0) * 0.25 * local_3b8 + local_3f8;
      local_2c8._4_4_ = (auVar225._4_4_ + 1.0) * 0.25 * local_3b8 + local_3f8;
      fStack_2c0 = (auVar225._8_4_ + 2.0) * 0.25 * local_3b8 + local_3f8;
      fStack_2bc = (auVar225._12_4_ + 3.0) * 0.25 * local_3b8 + local_3f8;
      local_2d8[0] = (auVar214._0_4_ + 0.0) * 0.25 * local_3b8 + local_3f8;
      local_2d8[1] = (auVar214._4_4_ + 1.0) * 0.25 * local_3b8 + local_3f8;
      local_2d8[2] = (auVar214._8_4_ + 2.0) * 0.25 * local_3b8 + local_3f8;
      local_2d8[3] = (auVar214._12_4_ + 3.0) * 0.25 * local_3b8 + local_3f8;
      local_578._0_4_ = (float)local_578._0_4_ - auVar70._0_4_ * auVar70._0_4_;
      local_578._4_4_ = (float)local_578._4_4_ - auVar70._4_4_ * auVar70._4_4_;
      fStack_570 = fStack_570 - auVar70._8_4_ * auVar70._8_4_;
      fStack_56c = fStack_56c - auVar70._12_4_ * auVar70._12_4_;
      auVar89._0_4_ = local_3e8 - local_368 * 4.0 * (float)local_578._0_4_;
      auVar89._4_4_ = fStack_3e4 - fStack_364 * 4.0 * (float)local_578._4_4_;
      auVar89._8_4_ = fStack_3e0 - fStack_360 * 4.0 * fStack_570;
      auVar89._12_4_ = fStack_3dc - fStack_35c * 4.0 * fStack_56c;
      local_338._4_4_ = -(uint)(0.0 <= auVar89._4_4_);
      local_338._0_4_ = -(uint)(0.0 <= auVar89._0_4_);
      local_338._8_4_ = -(uint)(0.0 <= auVar89._8_4_);
      local_338._12_4_ = -(uint)(0.0 <= auVar89._12_4_);
      iVar41 = movmskps(iVar41,local_338);
      if (iVar41 == 0) {
        _local_4f8 = ZEXT816(0);
        fVar158 = 0.0;
        fVar175 = 0.0;
        fVar177 = 0.0;
        fVar184 = 0.0;
        fVar140 = 0.0;
        fVar60 = 0.0;
        fVar101 = 0.0;
        fVar102 = 0.0;
        _local_548 = ZEXT816(0);
        _local_558 = ZEXT816(0);
        _local_478 = ZEXT816(0);
        iVar41 = 0;
        auVar128 = _DAT_01feb9f0;
        auVar217 = _DAT_01feba00;
      }
      else {
        auVar225 = sqrtps(auVar230,auVar89);
        auVar113._0_4_ = local_368 + local_368;
        auVar113._4_4_ = fStack_364 + fStack_364;
        auVar113._8_4_ = fStack_360 + fStack_360;
        auVar113._12_4_ = fStack_35c + fStack_35c;
        auVar70 = rcpps(_local_2c8,auVar113);
        fVar197 = auVar70._0_4_;
        fVar220 = auVar70._4_4_;
        fVar221 = auVar70._8_4_;
        fVar222 = auVar70._12_4_;
        fVar197 = ((float)DAT_01feca10 - auVar113._0_4_ * fVar197) * fVar197 + fVar197;
        fVar220 = (DAT_01feca10._4_4_ - auVar113._4_4_ * fVar220) * fVar220 + fVar220;
        fVar221 = (DAT_01feca10._8_4_ - auVar113._8_4_ * fVar221) * fVar221 + fVar221;
        fVar222 = (DAT_01feca10._12_4_ - auVar113._12_4_ * fVar222) * fVar222 + fVar222;
        fVar239 = (-local_178 - auVar225._0_4_) * fVar197;
        fVar240 = (-fStack_174 - auVar225._4_4_) * fVar220;
        fVar242 = (-fStack_170 - auVar225._8_4_) * fVar221;
        fVar249 = (-fStack_16c - auVar225._12_4_) * fVar222;
        fVar197 = (auVar225._0_4_ - local_178) * fVar197;
        fVar220 = (auVar225._4_4_ - fStack_174) * fVar220;
        fVar221 = (auVar225._8_4_ - fStack_170) * fVar221;
        fVar222 = (auVar225._12_4_ - fStack_16c) * fVar222;
        fVar158 = ((float)local_318._0_4_ * fVar239 + (float)local_328._0_4_) * fVar140;
        fVar232 = ((float)local_318._4_4_ * fVar240 + (float)local_328._4_4_) * fVar60;
        fVar233 = (fStack_310 * fVar242 + fStack_320) * fVar101;
        fVar234 = (fStack_30c * fVar249 + fStack_31c) * fVar102;
        local_548._4_4_ = fStack_304 * fVar240 - (fStack_584 * fVar232 + fVar261);
        local_548._0_4_ = local_308 * fVar239 - (local_588 * fVar158 + fVar260);
        fStack_540 = fStack_300 * fVar242 - (fStack_580 * fVar233 + fVar262);
        fStack_53c = fStack_2fc * fVar249 - (fStack_57c * fVar234 + fVar263);
        local_558._4_4_ = fStack_4d4 * fVar240 - ((float)local_408._4_4_ * fVar232 + fVar177);
        local_558._0_4_ = local_4d8 * fVar239 - ((float)local_408._0_4_ * fVar158 + fVar175);
        fStack_550 = fStack_4d0 * fVar242 - (fStack_400 * fVar233 + fVar184);
        fStack_54c = fStack_4cc * fVar249 - (fStack_3fc * fVar234 + fVar195);
        local_478._4_4_ = fStack_2f4 * fVar240 - (fVar232 * fVar120 + fVar183);
        local_478._0_4_ = local_2f8 * fVar239 - (fVar158 * fVar103 + fVar176);
        fStack_470 = fStack_2f0 * fVar242 - (fVar233 * fVar121 + fVar185);
        fStack_46c = fStack_2ec * fVar249 - (fVar234 * fVar122 + fVar196);
        fVar140 = ((float)local_318._0_4_ * fVar197 + (float)local_328._0_4_) * fVar140;
        fVar60 = ((float)local_318._4_4_ * fVar220 + (float)local_328._4_4_) * fVar60;
        fVar101 = (fStack_310 * fVar221 + fStack_320) * fVar101;
        fVar102 = (fStack_30c * fVar222 + fStack_31c) * fVar102;
        local_4f8._4_4_ = fStack_304 * fVar220 - (fStack_584 * fVar60 + fVar261);
        local_4f8._0_4_ = local_308 * fVar197 - (local_588 * fVar140 + fVar260);
        fStack_4f0 = fStack_300 * fVar221 - (fStack_580 * fVar101 + fVar262);
        fStack_4ec = fStack_2fc * fVar222 - (fStack_57c * fVar102 + fVar263);
        fVar158 = local_4d8 * fVar197 - ((float)local_408._0_4_ * fVar140 + fVar175);
        fVar175 = fStack_4d4 * fVar220 - ((float)local_408._4_4_ * fVar60 + fVar177);
        fVar177 = fStack_4d0 * fVar221 - (fStack_400 * fVar101 + fVar184);
        fVar184 = fStack_4cc * fVar222 - (fStack_3fc * fVar102 + fVar195);
        bVar9 = 0.0 <= auVar89._0_4_;
        uVar55 = -(uint)bVar9;
        bVar10 = 0.0 <= auVar89._4_4_;
        uVar56 = -(uint)bVar10;
        bVar11 = 0.0 <= auVar89._8_4_;
        uVar57 = -(uint)bVar11;
        bVar12 = 0.0 <= auVar89._12_4_;
        uVar58 = -(uint)bVar12;
        fVar140 = local_2f8 * fVar197 - (fVar140 * fVar103 + fVar176);
        fVar60 = fStack_2f4 * fVar220 - (fVar60 * fVar120 + fVar183);
        fVar101 = fStack_2f0 * fVar221 - (fVar101 * fVar121 + fVar185);
        fVar102 = fStack_2ec * fVar222 - (fVar102 * fVar122 + fVar196);
        auVar194._0_4_ = (uint)fVar239 & uVar55;
        auVar194._4_4_ = (uint)fVar240 & uVar56;
        auVar194._8_4_ = (uint)fVar242 & uVar57;
        auVar194._12_4_ = (uint)fVar249 & uVar58;
        auVar128._0_8_ = CONCAT44(~uVar56,~uVar55) & 0x7f8000007f800000;
        auVar128._8_4_ = ~uVar57 & 0x7f800000;
        auVar128._12_4_ = ~uVar58 & 0x7f800000;
        auVar128 = auVar128 | auVar194;
        auVar231._0_4_ = (uint)fVar197 & uVar55;
        auVar231._4_4_ = (uint)fVar220 & uVar56;
        auVar231._8_4_ = (uint)fVar221 & uVar57;
        auVar231._12_4_ = (uint)fVar222 & uVar58;
        auVar217._0_8_ = CONCAT44(~uVar56,~uVar55) & 0xff800000ff800000;
        auVar217._8_4_ = ~uVar57 & 0xff800000;
        auVar217._12_4_ = ~uVar58 & 0xff800000;
        auVar217 = auVar217 | auVar231;
        auVar90._0_8_ = CONCAT44(fStack_164,local_168) & 0x7fffffff7fffffff;
        auVar90._8_4_ = ABS(fStack_160);
        auVar90._12_4_ = ABS(fStack_15c);
        auVar24._4_4_ = fStack_294;
        auVar24._0_4_ = local_298;
        auVar24._8_4_ = fStack_290;
        auVar24._12_4_ = fStack_28c;
        auVar70 = maxps(auVar24,auVar90);
        fVar103 = auVar70._0_4_ * 1.9073486e-06;
        fVar120 = auVar70._4_4_ * 1.9073486e-06;
        fVar121 = auVar70._8_4_ * 1.9073486e-06;
        fVar122 = auVar70._12_4_ * 1.9073486e-06;
        auVar146._0_4_ = -(uint)(ABS(local_368) < fVar103 && bVar9);
        auVar146._4_4_ = -(uint)(ABS(fStack_364) < fVar120 && bVar10);
        auVar146._8_4_ = -(uint)(ABS(fStack_360) < fVar121 && bVar11);
        auVar146._12_4_ = -(uint)(ABS(fStack_35c) < fVar122 && bVar12);
        iVar41 = movmskps(iVar41,auVar146);
        if (iVar41 != 0) {
          uVar55 = -(uint)((float)local_578._0_4_ <= 0.0);
          uVar56 = -(uint)((float)local_578._4_4_ <= 0.0);
          uVar57 = -(uint)(fStack_570 <= 0.0);
          uVar58 = -(uint)(fStack_56c <= 0.0);
          auVar245._0_4_ = (uVar55 & 0xff800000 | ~uVar55 & 0x7f800000) & auVar146._0_4_;
          auVar245._4_4_ = (uVar56 & 0xff800000 | ~uVar56 & 0x7f800000) & auVar146._4_4_;
          auVar245._8_4_ = (uVar57 & 0xff800000 | ~uVar57 & 0x7f800000) & auVar146._8_4_;
          auVar245._12_4_ = (uVar58 & 0xff800000 | ~uVar58 & 0x7f800000) & auVar146._12_4_;
          auVar238._0_4_ = ~auVar146._0_4_ & auVar128._0_4_;
          auVar238._4_4_ = ~auVar146._4_4_ & auVar128._4_4_;
          auVar238._8_4_ = ~auVar146._8_4_ & auVar128._8_4_;
          auVar238._12_4_ = ~auVar146._12_4_ & auVar128._12_4_;
          auVar246._0_4_ = (uVar55 & 0x7f800000 | ~uVar55 & 0xff800000) & auVar146._0_4_;
          auVar246._4_4_ = (uVar56 & 0x7f800000 | ~uVar56 & 0xff800000) & auVar146._4_4_;
          auVar246._8_4_ = (uVar57 & 0x7f800000 | ~uVar57 & 0xff800000) & auVar146._8_4_;
          auVar246._12_4_ = (uVar58 & 0x7f800000 | ~uVar58 & 0xff800000) & auVar146._12_4_;
          auVar147._0_4_ = ~auVar146._0_4_ & auVar217._0_4_;
          auVar147._4_4_ = ~auVar146._4_4_ & auVar217._4_4_;
          auVar147._8_4_ = ~auVar146._8_4_ & auVar217._8_4_;
          auVar147._12_4_ = ~auVar146._12_4_ & auVar217._12_4_;
          local_338._4_4_ =
               -(uint)((fVar120 <= ABS(fStack_364) || (float)local_578._4_4_ <= 0.0) && bVar10);
          local_338._0_4_ =
               -(uint)((fVar103 <= ABS(local_368) || (float)local_578._0_4_ <= 0.0) && bVar9);
          local_338._8_4_ = -(uint)((fVar121 <= ABS(fStack_360) || fStack_570 <= 0.0) && bVar11);
          local_338._12_4_ = -(uint)((fVar122 <= ABS(fStack_35c) || fStack_56c <= 0.0) && bVar12);
          auVar128 = auVar238 | auVar245;
          auVar217 = auVar147 | auVar246;
        }
      }
      fVar103 = (ray->dir).field_0.m128[0];
      fVar120 = (ray->dir).field_0.m128[1];
      fVar121 = (ray->dir).field_0.m128[2];
      local_4f8._4_4_ =
           -(uint)(0.3 <= ABS((float)local_4f8._4_4_ * fVar103 +
                              fVar175 * fVar120 + fVar60 * fVar121));
      local_4f8._0_4_ =
           -(uint)(0.3 <= ABS((float)local_4f8._0_4_ * fVar103 +
                              fVar158 * fVar120 + fVar140 * fVar121));
      fStack_4f0 = (float)-(uint)(0.3 <= ABS(fStack_4f0 * fVar103 +
                                             fVar177 * fVar120 + fVar101 * fVar121));
      fStack_4ec = (float)-(uint)(0.3 <= ABS(fStack_4ec * fVar103 +
                                             fVar184 * fVar120 + fVar102 * fVar121));
      _local_118 = local_3d8;
      local_108 = minps(_local_598,auVar128);
      _local_1a8 = maxps(local_3d8,auVar217);
      local_198 = _local_598;
      local_348._0_4_ = -(uint)(fVar139 <= local_108._0_4_) & auVar270._0_4_;
      local_348._4_4_ = -(uint)(fVar141 <= local_108._4_4_) & auVar270._4_4_;
      local_348._8_4_ = -(uint)(fVar156 <= local_108._8_4_) & auVar270._8_4_;
      local_348._12_4_ = -(uint)(fVar157 <= local_108._12_4_) & auVar270._12_4_;
      local_358._0_8_ =
           CONCAT44(-(uint)(local_1a8._4_4_ <= local_598._4_4_) & auVar270._4_4_,
                    -(uint)(local_1a8._0_4_ <= local_598._0_4_) & auVar270._0_4_);
      local_358._8_4_ = -(uint)(local_1a8._8_4_ <= local_598._8_4_) & auVar270._8_4_;
      local_358._12_4_ = -(uint)(local_1a8._12_4_ <= local_598._12_4_) & auVar270._12_4_;
      auVar91._8_4_ = local_358._8_4_;
      auVar91._0_8_ = local_358._0_8_;
      auVar91._12_4_ = local_358._12_4_;
      iVar41 = movmskps(iVar41,auVar91 | local_348);
      lVar44 = CONCAT44(uVar48,iVar41);
      if (iVar41 != 0) {
        _local_408 = _local_1a8;
        local_368 = (float)(int)local_4b0;
        fStack_364 = (float)(int)local_4b0;
        fStack_360 = (float)(int)local_4b0;
        fStack_35c = (float)(int)local_4b0;
        local_478._0_4_ =
             -(uint)((int)local_4b0 <
                    ((int)((-(uint)(0.3 <= ABS((float)local_478._0_4_ * fVar121 +
                                               (float)local_558._0_4_ * fVar120 +
                                               (float)local_548._0_4_ * fVar103)) & local_338._0_4_)
                          << 0x1f) >> 0x1f) + 4);
        local_478._4_4_ =
             -(uint)((int)local_4b0 <
                    ((int)((-(uint)(0.3 <= ABS((float)local_478._4_4_ * fVar121 +
                                               (float)local_558._4_4_ * fVar120 +
                                               (float)local_548._4_4_ * fVar103)) & local_338._4_4_)
                          << 0x1f) >> 0x1f) + 4);
        fStack_470 = (float)-(uint)((int)local_4b0 <
                                   ((int)((-(uint)(0.3 <= ABS(fStack_470 * fVar121 +
                                                              fStack_550 * fVar120 +
                                                              fStack_540 * fVar103)) &
                                          local_338._8_4_) << 0x1f) >> 0x1f) + 4);
        fStack_46c = (float)-(uint)((int)local_4b0 <
                                   ((int)((-(uint)(0.3 <= ABS(fStack_46c * fVar121 +
                                                              fStack_54c * fVar120 +
                                                              fStack_53c * fVar103)) &
                                          local_338._12_4_) << 0x1f) >> 0x1f) + 4);
        _local_318 = local_348;
        local_348 = ~_local_478 & local_348;
        iVar41 = movmskps(iVar41,local_348);
        _local_328 = local_358;
        if (iVar41 != 0) {
          local_3e8 = local_4c8 + fVar139;
          fStack_3e4 = fStack_4c4 + fVar141;
          fStack_3e0 = fStack_4c0 + fVar156;
          fStack_3dc = fStack_4bc + fVar157;
          do {
            auVar225 = ~local_348 & _DAT_01feb9f0 | local_348 & local_3d8;
            auVar148._4_4_ = auVar225._0_4_;
            auVar148._0_4_ = auVar225._4_4_;
            auVar148._8_4_ = auVar225._12_4_;
            auVar148._12_4_ = auVar225._8_4_;
            auVar70 = minps(auVar148,auVar225);
            auVar114._0_8_ = auVar70._8_8_;
            auVar114._8_4_ = auVar70._0_4_;
            auVar114._12_4_ = auVar70._4_4_;
            auVar70 = minps(auVar114,auVar70);
            auVar115._0_8_ =
                 CONCAT44(-(uint)(auVar70._4_4_ == auVar225._4_4_) & local_348._4_4_,
                          -(uint)(auVar70._0_4_ == auVar225._0_4_) & local_348._0_4_);
            auVar115._8_4_ = -(uint)(auVar70._8_4_ == auVar225._8_4_) & local_348._8_4_;
            auVar115._12_4_ = -(uint)(auVar70._12_4_ == auVar225._12_4_) & local_348._12_4_;
            iVar41 = movmskps(iVar41,auVar115);
            auVar92 = local_348;
            if (iVar41 != 0) {
              auVar92._8_4_ = auVar115._8_4_;
              auVar92._0_8_ = auVar115._0_8_;
              auVar92._12_4_ = auVar115._12_4_;
            }
            uVar42 = movmskps(iVar41,auVar92);
            lVar44 = 0;
            if (CONCAT44(uVar48,uVar42) != 0) {
              for (; (CONCAT44(uVar48,uVar42) >> lVar44 & 1) == 0; lVar44 = lVar44 + 1) {
              }
            }
            *(undefined4 *)(local_348 + lVar44 * 4) = 0;
            fVar140 = *(float *)(local_2c8 + lVar44 * 4);
            fVar60 = *(float *)(local_118 + lVar44 * 4);
            fVar101 = (ray->dir).field_0.m128[0];
            fVar102 = (ray->dir).field_0.m128[1];
            fVar103 = (ray->dir).field_0.m128[2];
            local_518 = (ray->dir).field_0.field_1;
            fVar101 = fVar103 * fVar103 + fVar102 * fVar102 + fVar101 * fVar101;
            if (fVar101 < 0.0) {
              fVar101 = sqrtf(fVar101);
              lVar44 = extraout_RAX;
            }
            else {
              fVar101 = SQRT(fVar101);
            }
            uVar241 = 0;
            uVar42 = 0;
            uVar48 = 0;
            auVar14._4_4_ = fStack_4e4;
            auVar14._0_4_ = local_4e8;
            auVar14._8_4_ = fStack_4e0;
            auVar14._12_4_ = fStack_4dc;
            auVar20._4_4_ = fStack_444;
            auVar20._0_4_ = local_448;
            auVar20._8_4_ = fStack_440;
            auVar20._12_4_ = fStack_43c;
            auVar225 = minps(auVar14,auVar20);
            auVar214 = maxps(auVar14,auVar20);
            auVar18._4_4_ = fStack_454;
            auVar18._0_4_ = local_458;
            auVar18._8_4_ = fStack_450;
            auVar18._12_4_ = fStack_44c;
            auVar16._4_4_ = fStack_464;
            auVar16._0_4_ = local_468;
            auVar16._8_4_ = fStack_460;
            auVar16._12_4_ = fStack_45c;
            auVar70 = minps(auVar18,auVar16);
            auVar225 = minps(auVar225,auVar70);
            auVar70 = maxps(auVar18,auVar16);
            auVar70 = maxps(auVar214,auVar70);
            auVar166._0_8_ = auVar225._0_8_ & 0x7fffffff7fffffff;
            auVar166._8_4_ = auVar225._8_4_ & 0x7fffffff;
            auVar166._12_4_ = auVar225._12_4_ & 0x7fffffff;
            local_3c8 = auVar70._12_4_;
            auVar93._0_8_ = auVar70._0_8_ & 0x7fffffff7fffffff;
            auVar93._8_4_ = auVar70._8_4_ & 0x7fffffff;
            auVar93._12_4_ = ABS(local_3c8);
            auVar70 = maxps(auVar166,auVar93);
            fVar102 = auVar70._4_4_;
            if (auVar70._4_4_ <= auVar70._0_4_) {
              fVar102 = auVar70._0_4_;
            }
            auVar167._8_8_ = auVar70._8_8_;
            auVar167._0_8_ = auVar70._8_8_;
            if (auVar70._8_4_ <= fVar102) {
              auVar167._0_4_ = fVar102;
            }
            register0x00001304 = auVar167._4_12_;
            local_548._0_4_ = auVar167._0_4_ * 1.9073486e-06;
            local_3a8 = fVar101 * 1.9073486e-06;
            fStack_3c4 = local_3c8;
            fStack_3c0 = local_3c8;
            fStack_3bc = local_3c8;
            lVar52 = 5;
            do {
              fVar102 = 1.0 - fVar140;
              fVar101 = fVar140 * fVar140;
              local_5b8 = fVar140 * 3.0;
              local_568 = local_5b8 + -5.0;
              _local_5a8 = ZEXT416((uint)(fVar102 * fVar102));
              fVar122 = -fVar140 * fVar102 * fVar102 * 0.5;
              fVar103 = (fVar101 * local_568 + 2.0) * 0.5;
              fVar120 = ((fVar102 * 3.0 + -5.0) * fVar102 * fVar102 + 2.0) * 0.5;
              fVar121 = -fVar102 * fVar140 * fVar140 * 0.5;
              local_388 = fVar122 * local_4e8 +
                          fVar103 * local_448 + fVar120 * local_458 + fVar121 * local_468;
              fStack_384 = fVar122 * fStack_4e4 +
                           fVar103 * fStack_444 + fVar120 * fStack_454 + fVar121 * fStack_464;
              fStack_380 = fVar122 * fStack_4e0 +
                           fVar103 * fStack_440 + fVar120 * fStack_450 + fVar121 * fStack_460;
              fStack_37c = fVar122 * fStack_4dc +
                           fVar103 * fStack_43c + fVar120 * fStack_44c + fVar121 * fStack_45c;
              fVar103 = fVar140 * -9.0 + 4.0;
              local_588 = local_5b8 + -1.0;
              local_558._0_4_ = (fVar60 * local_518.x + 0.0) - local_388;
              local_558._4_4_ = (fVar60 * local_518.y + 0.0) - fStack_384;
              fStack_550 = (fVar60 * local_518.z + 0.0) - fStack_380;
              fStack_54c = (fVar60 * local_518.field_3.w + 0.0) - fStack_37c;
              fVar120 = (float)local_558._4_4_ * (float)local_558._4_4_;
              fVar121 = fStack_550 * fStack_550;
              fVar122 = fStack_54c * fStack_54c;
              local_598._0_4_ = fVar120 + (float)local_558._0_4_ * (float)local_558._0_4_ + fVar121;
              local_598._4_4_ = fVar120 + fVar120 + fVar122;
              fStack_590 = fVar120 + fVar121 + fVar121;
              fStack_58c = fVar120 + fVar122 + fVar122;
              local_398 = (float)local_598._0_4_;
              if ((float)local_598._0_4_ < 0.0) {
                _local_528 = ZEXT416((uint)fVar101);
                _local_538 = ZEXT416((uint)(fVar140 * 9.0));
                _local_578 = ZEXT416((uint)fVar102);
                fStack_3b4 = 0.0;
                fStack_3b0 = 0.0;
                fStack_3ac = 0.0;
                fStack_5b4 = (float)uVar48;
                fStack_5b0 = (float)uVar42;
                fStack_5ac = (float)uVar241;
                fStack_584 = (float)uVar48;
                fStack_580 = (float)uVar42;
                fStack_57c = (float)uVar241;
                fStack_564 = (float)uVar48;
                fStack_560 = (float)uVar42;
                fStack_55c = (float)uVar241;
                local_3b8 = fVar102 * -2.0;
                fVar122 = sqrtf((float)local_598._0_4_);
                lVar44 = extraout_RAX_00;
                fVar120 = (float)local_538._0_4_;
                fVar101 = (float)local_528._0_4_;
                fVar121 = local_3b8;
                fVar102 = (float)local_578._0_4_;
              }
              else {
                fVar122 = SQRT((float)local_598._0_4_);
                fVar120 = fVar140 * 9.0;
                fVar121 = fVar102 * -2.0;
              }
              fVar141 = (fVar140 * (fVar102 + fVar102) - (float)local_5a8._0_4_) * 0.5;
              fVar139 = ((fVar140 + fVar140) * local_568 + fVar140 * local_5b8) * 0.5;
              fVar102 = ((local_5b8 + 2.0) * (fVar102 + fVar102) + fVar102 * -3.0 * fVar102) * 0.5;
              fVar101 = (fVar121 * fVar140 + fVar101) * 0.5;
              local_568 = fVar141 * local_4e8 +
                          fVar139 * local_448 + fVar102 * local_458 + fVar101 * local_468;
              fStack_564 = fVar141 * fStack_4e4 +
                           fVar139 * fStack_444 + fVar102 * fStack_454 + fVar101 * fStack_464;
              fStack_560 = fVar141 * fStack_4e0 +
                           fVar139 * fStack_440 + fVar102 * fStack_450 + fVar101 * fStack_460;
              fStack_55c = fVar141 * fStack_4dc +
                           fVar139 * fStack_43c + fVar102 * fStack_44c + fVar101 * fStack_45c;
              fVar101 = fVar140 * -3.0 + 2.0;
              fVar120 = fVar120 + -5.0;
              fVar141 = local_588 * fStack_45c;
              fVar102 = fVar101 * local_4e8 +
                        fVar120 * local_448 + fVar103 * local_458 + local_588 * local_468;
              fVar121 = fVar101 * fStack_4e4 +
                        fVar120 * fStack_444 + fVar103 * fStack_454 + local_588 * fStack_464;
              fVar139 = fVar101 * fStack_4e0 +
                        fVar120 * fStack_440 + fVar103 * fStack_450 + local_588 * fStack_460;
              local_588 = (float)local_548._0_4_;
              if ((float)local_548._0_4_ <= local_3a8 * fVar60) {
                local_588 = local_3a8 * fVar60;
              }
              fStack_584 = (float)local_548._4_4_;
              fStack_580 = fStack_540;
              fStack_57c = fStack_53c;
              fVar156 = fStack_564 * fStack_564 + local_568 * local_568 + fStack_560 * fStack_560;
              auVar225 = ZEXT416((uint)fVar156);
              auVar70 = rsqrtss(ZEXT416((uint)fVar156),auVar225);
              fVar157 = auVar70._0_4_;
              fVar158 = fVar157 * fVar157 * fVar156 * -0.5 * fVar157 + fVar157 * 1.5;
              fVar157 = fVar139 * fStack_560 + fVar121 * fStack_564 + fVar102 * local_568;
              auVar70 = rcpss(auVar225,auVar225);
              fVar175 = (2.0 - fVar156 * auVar70._0_4_) * auVar70._0_4_;
              local_5b8 = fVar175 * (fVar156 * fVar102 - fVar157 * local_568) * fVar158;
              fStack_5b4 = fVar175 * (fVar156 * fVar121 - fVar157 * fStack_564) * fVar158;
              fStack_5b0 = fVar175 * (fVar156 * fVar139 - fVar157 * fStack_560) * fVar158;
              fStack_5ac = fVar175 * (fVar156 * (fVar101 * fStack_4dc +
                                                fVar120 * fStack_43c +
                                                fVar103 * fStack_44c + fVar141) -
                                     fVar157 * fStack_55c) * fVar158;
              fVar101 = -local_568;
              fVar102 = -fStack_564;
              fVar103 = -fStack_560;
              fVar120 = -fStack_55c;
              if (fVar156 < 0.0) {
                local_5a8._4_4_ = fStack_564 * fVar158;
                local_5a8._0_4_ = local_568 * fVar158;
                fStack_5a0 = fStack_560 * fVar158;
                fStack_59c = fStack_55c * fVar158;
                fVar156 = sqrtf(fVar156);
                lVar44 = extraout_RAX_01;
                fVar121 = (float)local_5a8._0_4_;
                fVar139 = (float)local_5a8._4_4_;
                fVar141 = fStack_5a0;
                fVar157 = fStack_59c;
              }
              else {
                fVar156 = SQRT(fVar156);
                fVar121 = local_568 * fVar158;
                fVar139 = fStack_564 * fVar158;
                fVar141 = fStack_560 * fVar158;
                fVar157 = fStack_55c * fVar158;
              }
              fVar158 = (float)local_558._4_4_ * fVar139;
              fVar175 = fStack_550 * fVar141;
              fStack_5ac = fStack_54c * fVar157;
              fVar177 = fVar158 + (float)local_558._0_4_ * fVar121 + fVar175;
              fVar183 = fVar158 + fVar158 + fStack_5ac;
              fVar175 = fVar158 + fVar175 + fVar175;
              fStack_5ac = fVar158 + fStack_5ac + fStack_5ac;
              fVar156 = (fVar122 + 1.0) * ((float)local_548._0_4_ / fVar156) +
                        fVar122 * (float)local_548._0_4_ + local_588;
              fVar176 = fVar141 * fVar103;
              fVar122 = fVar157 * fVar120;
              fVar158 = fVar176 + fVar139 * fVar102 + fVar121 * fVar101 +
                        fStack_5b0 * fStack_550 +
                        fStack_5b4 * (float)local_558._4_4_ + local_5b8 * (float)local_558._0_4_;
              local_528._0_4_ =
                   local_518.z * fVar141 + local_518.y * fVar139 + local_518.x * fVar121;
              fVar121 = (float)local_598._0_4_ - fVar177 * fVar177;
              auVar94._0_8_ = CONCAT44((float)local_598._4_4_ - fVar183 * fVar183,fVar121);
              auVar94._8_4_ = fStack_590 - fVar175 * fVar175;
              auVar94._12_4_ = fStack_58c - fStack_5ac * fStack_5ac;
              fVar101 = fVar101 * (float)local_558._0_4_;
              fVar102 = fVar102 * (float)local_558._4_4_;
              fVar103 = fVar103 * fStack_550;
              fVar120 = fVar120 * fStack_54c;
              local_528._4_4_ = local_518.field_3.w * fVar157;
              fStack_520 = local_518.z * fVar141;
              fStack_51c = local_518.field_3.w * fVar157;
              local_538._4_4_ = local_518.field_3.w * fStack_54c;
              local_538._0_4_ =
                   (local_518.z * fStack_550 +
                   local_518.y * (float)local_558._4_4_ + local_518.x * (float)local_558._0_4_) -
                   fVar177 * (float)local_528._0_4_;
              fStack_530 = local_518.z * fStack_550;
              fStack_52c = local_518.field_3.w * fStack_54c;
              auVar247._8_4_ = auVar94._8_4_;
              auVar247._0_8_ = auVar94._0_8_;
              auVar247._12_4_ = auVar94._12_4_;
              auVar70 = rsqrtss(auVar247,auVar94);
              fVar139 = auVar70._0_4_;
              auVar248._4_12_ = auVar70._4_12_;
              auVar248._0_4_ = fVar139 * fVar139 * fVar121 * -0.5 * fVar139 + fVar139 * 1.5;
              local_5b8 = fVar177;
              fStack_5b4 = fVar183;
              fStack_5b0 = fVar175;
              if (fVar121 < 0.0) {
                local_5a8._4_4_ = fVar122;
                local_5a8._0_4_ = fVar158;
                fStack_5a0 = fVar176;
                fStack_59c = fVar122;
                _local_578 = auVar248;
                fVar121 = sqrtf(fVar121);
                lVar44 = extraout_RAX_02;
                auVar248 = _local_578;
                fVar139 = (float)local_5a8._0_4_;
                fVar122 = (float)local_5a8._4_4_;
              }
              else {
                fVar121 = SQRT(fVar121);
                fVar139 = fVar158;
              }
              fVar121 = fVar121 - fStack_37c;
              fVar101 = ((fVar103 + fVar102 + fVar101) - fVar177 * fVar158) * auVar248._0_4_ -
                        fStack_55c;
              auVar129._4_12_ = local_538._4_12_;
              auVar129._0_4_ = local_538._0_4_ * auVar248._0_4_;
              auVar150._8_4_ = -fVar120;
              auVar150._0_8_ = CONCAT44(fVar120,fVar101) ^ 0x8000000000000000;
              auVar150._12_4_ = fVar122;
              auVar149._8_8_ = auVar150._8_8_;
              auVar149._0_8_ = CONCAT44(fVar139,fVar101) ^ 0x80000000;
              auVar218._0_4_ = fVar139 * auVar129._0_4_ - (float)local_528._0_4_ * fVar101;
              auVar131._0_8_ = auVar129._0_8_;
              auVar131._8_4_ = local_538._4_4_;
              auVar131._12_4_ = local_528._4_4_ ^ 0x80000000;
              auVar130._8_8_ = auVar131._8_8_;
              auVar130._0_8_ = CONCAT44(local_528._0_4_,auVar129._0_4_) ^ 0x8000000000000000;
              auVar218._4_4_ = auVar218._0_4_;
              auVar218._8_4_ = auVar218._0_4_;
              auVar218._12_4_ = auVar218._0_4_;
              auVar70 = divps(auVar130,auVar218);
              auVar225 = divps(auVar149,auVar218);
              fVar140 = fVar140 - (auVar70._4_4_ * fVar121 + auVar70._0_4_ * local_5b8);
              fVar60 = fVar60 - (auVar225._4_4_ * fVar121 + auVar225._0_4_ * local_5b8);
              lVar44 = CONCAT71((int7)((ulong)lVar44 >> 8),1);
              if ((ABS(local_5b8) < fVar156) &&
                 (ABS(fVar121) < local_3c8 * 1.9073486e-06 + local_588 + fVar156)) {
                fVar60 = fVar60 + (float)local_2e8._0_4_;
                if (((ray->org).field_0.m128[3] <= fVar60) &&
                   (((fVar101 = ray->tfar, fVar60 <= fVar101 && (0.0 <= fVar140)) &&
                    (fVar140 <= 1.0)))) {
                  auVar70 = rsqrtss(_local_598,_local_598);
                  fVar102 = auVar70._0_4_;
                  pGVar7 = (context->scene->geometries).items[local_500].ptr;
                  if ((pGVar7->mask & ray->mask) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                      uVar54 = 1;
                    }
                    else {
                      fVar102 = fVar102 * 1.5 + fVar102 * fVar102 * local_398 * -0.5 * fVar102;
                      fVar122 = (float)local_558._0_4_ * fVar102;
                      fVar141 = (float)local_558._4_4_ * fVar102;
                      fVar102 = fStack_550 * fVar102;
                      fVar103 = fStack_55c * fVar122 + local_568;
                      fVar120 = fStack_55c * fVar141 + fStack_564;
                      fVar121 = fStack_55c * fVar102 + fStack_560;
                      fVar139 = fVar141 * local_568 - fStack_564 * fVar122;
                      fVar141 = fVar102 * fStack_564 - fStack_560 * fVar141;
                      fVar102 = fVar122 * fStack_560 - local_568 * fVar102;
                      local_438 = CONCAT44(fVar103 * fVar139 - fVar141 * fVar121,
                                           fVar121 * fVar102 - fVar139 * fVar120);
                      fStack_430 = fVar120 * fVar141 - fVar102 * fVar103;
                      fStack_42c = fVar140;
                      local_428 = 0;
                      local_424 = (int)local_370;
                      local_420 = (int)local_500;
                      local_41c = context->user->instID[0];
                      local_418 = context->user->instPrimID[0];
                      ray->tfar = fVar60;
                      local_5bc = 0xffffffff;
                      local_4a8.geometryUserPtr = pGVar7->userPtr;
                      local_4a8.valid = &local_5bc;
                      local_4a8.context = context->user;
                      local_4a8.hit = (RTCHitN *)&local_438;
                      local_4a8.N = 1;
                      local_4a8.ray = (RTCRayN *)ray;
                      if (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00b59d4e:
                        p_Var8 = context->args->filter;
                        if (p_Var8 != (RTCFilterFunctionN)0x0) {
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar7->field_8).field_0x2 & 0x40) != 0)) {
                            pRVar51 = &local_4a8;
                            (*p_Var8)(pRVar51);
                          }
                          if (*local_4a8.valid == 0) goto LAB_00b59da8;
                        }
                        uVar54 = 1;
                      }
                      else {
                        pRVar51 = &local_4a8;
                        (*pGVar7->occlusionFilterN)(pRVar51);
                        if (*local_4a8.valid != 0) goto LAB_00b59d4e;
LAB_00b59da8:
                        uVar54 = 0;
                      }
                      if ((char)uVar54 == '\0') {
                        ray->tfar = fVar101;
                      }
                    }
                    lVar44 = 0;
                    goto LAB_00b59bcc;
                  }
                }
                lVar44 = 0;
                uVar54 = 0;
              }
LAB_00b59bcc:
              bVar53 = (byte)uVar54;
              if ((char)lVar44 == '\0') goto LAB_00b59dc2;
              lVar52 = lVar52 + -1;
            } while (lVar52 != 0);
            bVar53 = 0;
LAB_00b59dc2:
            uVar54 = (ulong)(bVar53 & 1);
            fVar140 = ray->tfar;
            local_348._0_4_ = -(uint)(local_3e8 <= fVar140) & local_348._0_4_;
            local_348._4_4_ = -(uint)(fStack_3e4 <= fVar140) & local_348._4_4_;
            local_348._8_4_ = -(uint)(fStack_3e0 <= fVar140) & local_348._8_4_;
            local_348._12_4_ = -(uint)(fStack_3dc <= fVar140) & local_348._12_4_;
            bVar46 = bVar46 | bVar53 & 1;
            uVar48 = (undefined4)((ulong)lVar44 >> 0x20);
            iVar41 = movmskps((int)lVar44,local_348);
          } while (iVar41 != 0);
        }
        fVar140 = ray->tfar;
        local_408._0_4_ = -(uint)((float)local_408._0_4_ + local_4c8 <= fVar140) & local_328._0_4_;
        local_408._4_4_ = -(uint)((float)local_408._4_4_ + fStack_4c4 <= fVar140) & local_328._4_4_;
        fStack_400 = (float)(-(uint)(fStack_400 + fStack_4c0 <= fVar140) & (uint)fStack_320);
        fStack_3fc = (float)(-(uint)(fStack_3fc + fStack_4bc <= fVar140) & (uint)fStack_31c);
        local_4f8._0_4_ =
             -(uint)((int)local_368 <
                    ((int)((local_4f8._0_4_ & local_338._0_4_) << 0x1f) >> 0x1f) + 4);
        local_4f8._4_4_ =
             -(uint)((int)fStack_364 <
                    ((int)((local_4f8._4_4_ & local_338._4_4_) << 0x1f) >> 0x1f) + 4);
        fStack_4f0 = (float)-(uint)((int)fStack_360 <
                                   ((int)(((uint)fStack_4f0 & local_338._8_4_) << 0x1f) >> 0x1f) + 4
                                   );
        fStack_4ec = (float)-(uint)((int)fStack_35c <
                                   ((int)(((uint)fStack_4ec & local_338._12_4_) << 0x1f) >> 0x1f) +
                                   4);
        local_358 = ~_local_4f8 & _local_408;
        iVar41 = movmskps(iVar41,local_358);
        if (iVar41 != 0) {
          local_3d8 = _local_1a8;
          local_3e8 = local_4c8 + (float)local_1a8._0_4_;
          fStack_3e4 = fStack_4c4 + (float)local_1a8._4_4_;
          fStack_3e0 = fStack_4c0 + fStack_1a0;
          fStack_3dc = fStack_4bc + fStack_19c;
          do {
            auVar225 = ~local_358 & _DAT_01feb9f0 | local_358 & local_3d8;
            auVar151._4_4_ = auVar225._0_4_;
            auVar151._0_4_ = auVar225._4_4_;
            auVar151._8_4_ = auVar225._12_4_;
            auVar151._12_4_ = auVar225._8_4_;
            auVar70 = minps(auVar151,auVar225);
            auVar116._0_8_ = auVar70._8_8_;
            auVar116._8_4_ = auVar70._0_4_;
            auVar116._12_4_ = auVar70._4_4_;
            auVar70 = minps(auVar116,auVar70);
            auVar117._0_8_ =
                 CONCAT44(-(uint)(auVar70._4_4_ == auVar225._4_4_) & local_358._4_4_,
                          -(uint)(auVar70._0_4_ == auVar225._0_4_) & local_358._0_4_);
            auVar117._8_4_ = -(uint)(auVar70._8_4_ == auVar225._8_4_) & local_358._8_4_;
            auVar117._12_4_ = -(uint)(auVar70._12_4_ == auVar225._12_4_) & local_358._12_4_;
            iVar41 = movmskps(iVar41,auVar117);
            auVar95 = local_358;
            if (iVar41 != 0) {
              auVar95._8_4_ = auVar117._8_4_;
              auVar95._0_8_ = auVar117._0_8_;
              auVar95._12_4_ = auVar117._12_4_;
            }
            uVar42 = movmskps(iVar41,auVar95);
            lVar44 = 0;
            if (CONCAT44(uVar48,uVar42) != 0) {
              for (; (CONCAT44(uVar48,uVar42) >> lVar44 & 1) == 0; lVar44 = lVar44 + 1) {
              }
            }
            *(undefined4 *)(local_358 + lVar44 * 4) = 0;
            fVar140 = local_2d8[lVar44];
            fVar60 = *(float *)(local_198 + lVar44 * 4);
            fVar101 = (ray->dir).field_0.m128[0];
            fVar102 = (ray->dir).field_0.m128[1];
            fVar103 = (ray->dir).field_0.m128[2];
            local_518 = (ray->dir).field_0.field_1;
            fVar101 = fVar103 * fVar103 + fVar102 * fVar102 + fVar101 * fVar101;
            if (fVar101 < 0.0) {
              fVar101 = sqrtf(fVar101);
              lVar44 = extraout_RAX_03;
            }
            else {
              fVar101 = SQRT(fVar101);
            }
            auVar15._4_4_ = fStack_4e4;
            auVar15._0_4_ = local_4e8;
            auVar15._8_4_ = fStack_4e0;
            auVar15._12_4_ = fStack_4dc;
            auVar21._4_4_ = fStack_444;
            auVar21._0_4_ = local_448;
            auVar21._8_4_ = fStack_440;
            auVar21._12_4_ = fStack_43c;
            auVar225 = minps(auVar15,auVar21);
            auVar214 = maxps(auVar15,auVar21);
            auVar19._4_4_ = fStack_454;
            auVar19._0_4_ = local_458;
            auVar19._8_4_ = fStack_450;
            auVar19._12_4_ = fStack_44c;
            auVar17._4_4_ = fStack_464;
            auVar17._0_4_ = local_468;
            auVar17._8_4_ = fStack_460;
            auVar17._12_4_ = fStack_45c;
            auVar70 = minps(auVar19,auVar17);
            auVar225 = minps(auVar225,auVar70);
            auVar70 = maxps(auVar19,auVar17);
            auVar70 = maxps(auVar214,auVar70);
            auVar168._0_8_ = auVar225._0_8_ & 0x7fffffff7fffffff;
            auVar168._8_4_ = auVar225._8_4_ & 0x7fffffff;
            auVar168._12_4_ = auVar225._12_4_ & 0x7fffffff;
            local_3c8 = auVar70._12_4_;
            auVar96._0_8_ = auVar70._0_8_ & 0x7fffffff7fffffff;
            auVar96._8_4_ = auVar70._8_4_ & 0x7fffffff;
            auVar96._12_4_ = ABS(local_3c8);
            auVar70 = maxps(auVar168,auVar96);
            fVar102 = auVar70._4_4_;
            if (auVar70._4_4_ <= auVar70._0_4_) {
              fVar102 = auVar70._0_4_;
            }
            auVar169._8_8_ = auVar70._8_8_;
            auVar169._0_8_ = auVar70._8_8_;
            if (auVar70._8_4_ <= fVar102) {
              auVar169._0_4_ = fVar102;
            }
            register0x00001304 = auVar169._4_12_;
            local_548._0_4_ = auVar169._0_4_ * 1.9073486e-06;
            local_3a8 = fVar101 * 1.9073486e-06;
            fStack_3c4 = local_3c8;
            fStack_3c0 = local_3c8;
            fStack_3bc = local_3c8;
            lVar52 = 5;
            do {
              fVar102 = 1.0 - fVar140;
              fVar101 = fVar140 * fVar140;
              local_5b8 = fVar140 * 3.0;
              local_568 = local_5b8 + -5.0;
              _local_5a8 = ZEXT416((uint)(fVar102 * fVar102));
              fVar122 = -fVar140 * fVar102 * fVar102 * 0.5;
              fVar103 = (fVar101 * local_568 + 2.0) * 0.5;
              fVar120 = ((fVar102 * 3.0 + -5.0) * fVar102 * fVar102 + 2.0) * 0.5;
              fVar121 = -fVar102 * fVar140 * fVar140 * 0.5;
              local_388 = fVar122 * local_4e8 +
                          fVar103 * local_448 + fVar120 * local_458 + fVar121 * local_468;
              fStack_384 = fVar122 * fStack_4e4 +
                           fVar103 * fStack_444 + fVar120 * fStack_454 + fVar121 * fStack_464;
              fStack_380 = fVar122 * fStack_4e0 +
                           fVar103 * fStack_440 + fVar120 * fStack_450 + fVar121 * fStack_460;
              fStack_37c = fVar122 * fStack_4dc +
                           fVar103 * fStack_43c + fVar120 * fStack_44c + fVar121 * fStack_45c;
              fVar103 = fVar140 * -9.0 + 4.0;
              _local_598 = ZEXT416((uint)(local_5b8 + -1.0));
              local_558._0_4_ = (fVar60 * local_518.x + 0.0) - local_388;
              local_558._4_4_ = (fVar60 * local_518.y + 0.0) - fStack_384;
              fStack_550 = (fVar60 * local_518.z + 0.0) - fStack_380;
              fStack_54c = (fVar60 * local_518.field_3.w + 0.0) - fStack_37c;
              fVar120 = (float)local_558._4_4_ * (float)local_558._4_4_;
              fStack_580 = fStack_550 * fStack_550;
              fStack_57c = fStack_54c * fStack_54c;
              local_588 = fVar120 + (float)local_558._0_4_ * (float)local_558._0_4_ + fStack_580;
              fStack_584 = fVar120 + fVar120 + fStack_57c;
              fStack_580 = fVar120 + fStack_580 + fStack_580;
              fStack_57c = fVar120 + fStack_57c + fStack_57c;
              local_398 = local_588;
              if (local_588 < 0.0) {
                _local_528 = ZEXT416((uint)fVar101);
                _local_538 = ZEXT416((uint)(fVar140 * 9.0));
                _local_578 = ZEXT416((uint)fVar102);
                fStack_3b4 = 0.0;
                fStack_3b0 = 0.0;
                fStack_3ac = 0.0;
                fStack_5b4 = (float)0;
                fStack_5b0 = (float)0;
                fStack_5ac = (float)0;
                fStack_564 = (float)0;
                fStack_560 = (float)0;
                fStack_55c = (float)0;
                local_3b8 = fVar102 * -2.0;
                fVar122 = sqrtf(local_588);
                lVar44 = extraout_RAX_04;
                fVar120 = (float)local_538._0_4_;
                fVar101 = (float)local_528._0_4_;
                fVar121 = local_3b8;
                fVar102 = (float)local_578._0_4_;
              }
              else {
                fVar122 = SQRT(local_588);
                fVar120 = fVar140 * 9.0;
                fVar121 = fVar102 * -2.0;
              }
              fVar141 = (fVar140 * (fVar102 + fVar102) - (float)local_5a8._0_4_) * 0.5;
              fVar139 = ((fVar140 + fVar140) * local_568 + fVar140 * local_5b8) * 0.5;
              fVar102 = ((local_5b8 + 2.0) * (fVar102 + fVar102) + fVar102 * -3.0 * fVar102) * 0.5;
              fVar101 = (fVar121 * fVar140 + fVar101) * 0.5;
              local_568 = fVar141 * local_4e8 +
                          fVar139 * local_448 + fVar102 * local_458 + fVar101 * local_468;
              fStack_564 = fVar141 * fStack_4e4 +
                           fVar139 * fStack_444 + fVar102 * fStack_454 + fVar101 * fStack_464;
              fStack_560 = fVar141 * fStack_4e0 +
                           fVar139 * fStack_440 + fVar102 * fStack_450 + fVar101 * fStack_460;
              fStack_55c = fVar141 * fStack_4dc +
                           fVar139 * fStack_43c + fVar102 * fStack_44c + fVar101 * fStack_45c;
              fVar101 = fVar140 * -3.0 + 2.0;
              fVar120 = fVar120 + -5.0;
              fVar141 = (float)local_598._0_4_ * fStack_45c;
              fVar102 = fVar101 * local_4e8 +
                        fVar120 * local_448 +
                        fVar103 * local_458 + (float)local_598._0_4_ * local_468;
              fVar121 = fVar101 * fStack_4e4 +
                        fVar120 * fStack_444 +
                        fVar103 * fStack_454 + (float)local_598._0_4_ * fStack_464;
              fVar139 = fVar101 * fStack_4e0 +
                        fVar120 * fStack_440 +
                        fVar103 * fStack_450 + (float)local_598._0_4_ * fStack_460;
              local_598._0_4_ = local_548._0_4_;
              if ((float)local_548._0_4_ <= local_3a8 * fVar60) {
                local_598._0_4_ = local_3a8 * fVar60;
              }
              local_598._4_4_ = local_548._4_4_;
              fStack_590 = fStack_540;
              fStack_58c = fStack_53c;
              fVar156 = fStack_564 * fStack_564 + local_568 * local_568 + fStack_560 * fStack_560;
              auVar225 = ZEXT416((uint)fVar156);
              auVar70 = rsqrtss(ZEXT416((uint)fVar156),auVar225);
              fVar157 = auVar70._0_4_;
              fVar158 = fVar157 * fVar157 * fVar156 * -0.5 * fVar157 + fVar157 * 1.5;
              fVar157 = fVar139 * fStack_560 + fVar121 * fStack_564 + fVar102 * local_568;
              auVar70 = rcpss(auVar225,auVar225);
              fVar175 = (2.0 - fVar156 * auVar70._0_4_) * auVar70._0_4_;
              local_5b8 = fVar175 * (fVar156 * fVar102 - fVar157 * local_568) * fVar158;
              fStack_5b4 = fVar175 * (fVar156 * fVar121 - fVar157 * fStack_564) * fVar158;
              fStack_5b0 = fVar175 * (fVar156 * fVar139 - fVar157 * fStack_560) * fVar158;
              fStack_5ac = fVar175 * (fVar156 * (fVar101 * fStack_4dc +
                                                fVar120 * fStack_43c +
                                                fVar103 * fStack_44c + fVar141) -
                                     fVar157 * fStack_55c) * fVar158;
              fVar101 = -local_568;
              fVar102 = -fStack_564;
              fVar103 = -fStack_560;
              fVar120 = -fStack_55c;
              if (fVar156 < 0.0) {
                local_5a8._4_4_ = fStack_564 * fVar158;
                local_5a8._0_4_ = local_568 * fVar158;
                fStack_5a0 = fStack_560 * fVar158;
                fStack_59c = fStack_55c * fVar158;
                fVar156 = sqrtf(fVar156);
                lVar44 = extraout_RAX_05;
                fVar121 = (float)local_5a8._0_4_;
                fVar139 = (float)local_5a8._4_4_;
                fVar141 = fStack_5a0;
                fVar157 = fStack_59c;
              }
              else {
                fVar156 = SQRT(fVar156);
                fVar121 = local_568 * fVar158;
                fVar139 = fStack_564 * fVar158;
                fVar141 = fStack_560 * fVar158;
                fVar157 = fStack_55c * fVar158;
              }
              fVar158 = (float)local_558._4_4_ * fVar139;
              fVar175 = fStack_550 * fVar141;
              fStack_5ac = fStack_54c * fVar157;
              fVar183 = fVar158 + (float)local_558._0_4_ * fVar121 + fVar175;
              fVar184 = fVar158 + fVar158 + fStack_5ac;
              fVar175 = fVar158 + fVar175 + fVar175;
              fStack_5ac = fVar158 + fStack_5ac + fStack_5ac;
              fVar158 = (fVar122 + 1.0) * ((float)local_548._0_4_ / fVar156) +
                        fVar122 * (float)local_548._0_4_ + (float)local_598._0_4_;
              fVar122 = local_518.field_3.w * fVar157;
              fVar177 = fVar141 * fVar103;
              fVar157 = fVar157 * fVar120;
              fVar176 = fVar177 + fVar139 * fVar102 + fVar121 * fVar101 +
                        fStack_5b0 * fStack_550 +
                        fStack_5b4 * (float)local_558._4_4_ + local_5b8 * (float)local_558._0_4_;
              fVar121 = local_518.z * fVar141 + local_518.y * fVar139 + local_518.x * fVar121;
              auVar170._4_4_ = fStack_584;
              auVar170._0_4_ = local_588;
              auVar170._8_4_ = fStack_580;
              auVar170._12_4_ = fStack_57c;
              fVar139 = local_588 - fVar183 * fVar183;
              auVar97._0_8_ = CONCAT44(fStack_584 - fVar184 * fVar184,fVar139);
              auVar97._8_4_ = fStack_580 - fVar175 * fVar175;
              auVar97._12_4_ = fStack_57c - fStack_5ac * fStack_5ac;
              fVar101 = fVar101 * (float)local_558._0_4_;
              fVar102 = fVar102 * (float)local_558._4_4_;
              fVar103 = fVar103 * fStack_550;
              fVar120 = fVar120 * fStack_54c;
              local_528._4_4_ = local_518.field_3.w * fStack_54c;
              local_528._0_4_ =
                   (local_518.z * fStack_550 +
                   local_518.y * (float)local_558._4_4_ + local_518.x * (float)local_558._0_4_) -
                   fVar183 * fVar121;
              fStack_520 = local_518.z * fStack_550;
              fStack_51c = local_518.field_3.w * fStack_54c;
              auVar152._8_4_ = auVar97._8_4_;
              auVar152._0_8_ = auVar97._0_8_;
              auVar152._12_4_ = auVar97._12_4_;
              auVar70 = rsqrtss(auVar152,auVar97);
              fVar156 = auVar70._0_4_;
              register0x000012c4 = auVar70._4_12_;
              local_538._0_4_ = fVar156 * fVar156 * fVar139 * -0.5 * fVar156 + fVar156 * 1.5;
              local_5b8 = fVar183;
              fStack_5b4 = fVar184;
              fStack_5b0 = fVar175;
              if (fVar139 < 0.0) {
                local_5a8._4_4_ = fVar157;
                local_5a8._0_4_ = fVar176;
                fStack_5a0 = fVar177;
                fStack_59c = fVar157;
                local_578._4_4_ = fVar122;
                local_578._0_4_ = fVar121;
                fStack_570 = local_518.z * fVar141;
                fStack_56c = fVar122;
                fVar139 = sqrtf(fVar139);
                auVar170._4_4_ = fStack_584;
                auVar170._0_4_ = local_588;
                auVar170._8_4_ = fStack_580;
                auVar170._12_4_ = fStack_57c;
                lVar44 = extraout_RAX_06;
                fVar141 = (float)local_5a8._0_4_;
                fVar157 = (float)local_5a8._4_4_;
                fVar121 = (float)local_578._0_4_;
                fVar122 = (float)local_578._4_4_;
              }
              else {
                fVar139 = SQRT(fVar139);
                fVar141 = fVar176;
              }
              fVar139 = fVar139 - fStack_37c;
              fVar101 = ((fVar103 + fVar102 + fVar101) - fVar183 * fVar176) * (float)local_538._0_4_
                        - fStack_55c;
              auVar132._4_12_ = local_528._4_12_;
              auVar132._0_4_ = local_528._0_4_ * (float)local_538._0_4_;
              auVar154._8_4_ = -fVar120;
              auVar154._0_8_ = CONCAT44(fVar120,fVar101) ^ 0x8000000000000000;
              auVar154._12_4_ = fVar157;
              auVar153._8_8_ = auVar154._8_8_;
              auVar153._0_8_ = CONCAT44(fVar141,fVar101) ^ 0x80000000;
              auVar219._0_4_ = fVar141 * auVar132._0_4_ - fVar121 * fVar101;
              auVar134._0_8_ = auVar132._0_8_;
              auVar134._8_4_ = local_528._4_4_;
              auVar134._12_4_ = -fVar122;
              auVar133._8_8_ = auVar134._8_8_;
              auVar133._0_8_ = CONCAT44(fVar121,auVar132._0_4_) ^ 0x8000000000000000;
              auVar219._4_4_ = auVar219._0_4_;
              auVar219._8_4_ = auVar219._0_4_;
              auVar219._12_4_ = auVar219._0_4_;
              auVar70 = divps(auVar133,auVar219);
              auVar225 = divps(auVar153,auVar219);
              fVar140 = fVar140 - (auVar70._4_4_ * fVar139 + auVar70._0_4_ * local_5b8);
              fVar60 = fVar60 - (auVar225._4_4_ * fVar139 + auVar225._0_4_ * local_5b8);
              lVar44 = CONCAT71((int7)((ulong)lVar44 >> 8),1);
              if ((ABS(local_5b8) < fVar158) &&
                 (ABS(fVar139) < local_3c8 * 1.9073486e-06 + (float)local_598._0_4_ + fVar158)) {
                fVar60 = fVar60 + (float)local_2e8._0_4_;
                if (((ray->org).field_0.m128[3] <= fVar60) &&
                   (((fVar101 = ray->tfar, fVar60 <= fVar101 && (0.0 <= fVar140)) &&
                    (fVar140 <= 1.0)))) {
                  auVar70 = rsqrtss(auVar170,auVar170);
                  fVar102 = auVar70._0_4_;
                  pGVar7 = (context->scene->geometries).items[local_500].ptr;
                  if ((pGVar7->mask & ray->mask) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                      uVar54 = 1;
                    }
                    else {
                      fVar102 = fVar102 * 1.5 + fVar102 * fVar102 * local_398 * -0.5 * fVar102;
                      fVar122 = (float)local_558._0_4_ * fVar102;
                      fVar141 = (float)local_558._4_4_ * fVar102;
                      fVar102 = fStack_550 * fVar102;
                      fVar103 = fStack_55c * fVar122 + local_568;
                      fVar120 = fStack_55c * fVar141 + fStack_564;
                      fVar121 = fStack_55c * fVar102 + fStack_560;
                      fVar139 = fVar141 * local_568 - fStack_564 * fVar122;
                      fVar141 = fVar102 * fStack_564 - fStack_560 * fVar141;
                      fVar102 = fVar122 * fStack_560 - local_568 * fVar102;
                      local_438 = CONCAT44(fVar103 * fVar139 - fVar141 * fVar121,
                                           fVar121 * fVar102 - fVar139 * fVar120);
                      fStack_430 = fVar120 * fVar141 - fVar102 * fVar103;
                      fStack_42c = fVar140;
                      local_428 = 0;
                      local_424 = (int)local_370;
                      local_420 = (int)local_500;
                      local_41c = context->user->instID[0];
                      local_418 = context->user->instPrimID[0];
                      ray->tfar = fVar60;
                      local_5bc = 0xffffffff;
                      local_4a8.geometryUserPtr = pGVar7->userPtr;
                      local_4a8.valid = &local_5bc;
                      local_4a8.context = context->user;
                      local_4a8.hit = (RTCHitN *)&local_438;
                      local_4a8.N = 1;
                      local_4a8.ray = (RTCRayN *)ray;
                      if (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00b5a8eb:
                        p_Var8 = context->args->filter;
                        if (p_Var8 != (RTCFilterFunctionN)0x0) {
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar7->field_8).field_0x2 & 0x40) != 0)) {
                            pRVar51 = &local_4a8;
                            (*p_Var8)(pRVar51);
                          }
                          if (*local_4a8.valid == 0) goto LAB_00b5a945;
                        }
                        uVar54 = 1;
                      }
                      else {
                        pRVar51 = &local_4a8;
                        (*pGVar7->occlusionFilterN)(pRVar51);
                        if (*local_4a8.valid != 0) goto LAB_00b5a8eb;
LAB_00b5a945:
                        uVar54 = 0;
                      }
                      if ((char)uVar54 == '\0') {
                        ray->tfar = fVar101;
                      }
                    }
                    lVar44 = 0;
                    goto LAB_00b5a76a;
                  }
                }
                lVar44 = 0;
                uVar54 = 0;
              }
LAB_00b5a76a:
              bVar53 = (byte)uVar54;
              if ((char)lVar44 == '\0') goto LAB_00b5a95f;
              lVar52 = lVar52 + -1;
            } while (lVar52 != 0);
            bVar53 = 0;
LAB_00b5a95f:
            uVar54 = (ulong)(bVar53 & 1);
            fVar140 = ray->tfar;
            local_358._0_4_ = -(uint)(local_3e8 <= fVar140) & local_358._0_4_;
            local_358._4_4_ = -(uint)(fStack_3e4 <= fVar140) & local_358._4_4_;
            local_358._8_4_ = -(uint)(fStack_3e0 <= fVar140) & local_358._8_4_;
            local_358._12_4_ = -(uint)(fStack_3dc <= fVar140) & local_358._12_4_;
            bVar46 = bVar46 | bVar53 & 1;
            uVar48 = (undefined4)((ulong)lVar44 >> 0x20);
            iVar41 = movmskps((int)lVar44,local_358);
          } while (iVar41 != 0);
        }
        fVar140 = ray->tfar;
        auVar171._0_4_ =
             local_478._0_4_ & local_318._0_4_ &
             -(uint)(local_4c8 + (float)local_118._0_4_ <= fVar140);
        auVar171._4_4_ =
             local_478._4_4_ & local_318._4_4_ &
             -(uint)(fStack_4c4 + (float)local_118._4_4_ <= fVar140);
        auVar171._8_4_ =
             (uint)fStack_470 & (uint)fStack_310 & -(uint)(fStack_4c0 + fStack_110 <= fVar140);
        auVar171._12_4_ =
             (uint)fStack_46c & (uint)fStack_30c & -(uint)(fStack_4bc + fStack_10c <= fVar140);
        auVar135._0_4_ =
             local_4f8._0_4_ & local_408._0_4_ &
             -(uint)(local_4c8 + (float)local_1a8._0_4_ <= fVar140);
        auVar135._4_4_ =
             local_4f8._4_4_ & local_408._4_4_ &
             -(uint)(fStack_4c4 + (float)local_1a8._4_4_ <= fVar140);
        auVar135._8_4_ =
             (uint)fStack_4f0 & (uint)fStack_400 & -(uint)(fStack_4c0 + fStack_1a0 <= fVar140);
        auVar135._12_4_ =
             (uint)fStack_4ec & (uint)fStack_3fc & -(uint)(fStack_4bc + fStack_19c <= fVar140);
        iVar41 = movmskps(0,auVar135 | auVar171);
        lVar44 = CONCAT44(uVar48,iVar41);
        if (iVar41 != 0) {
          lVar44 = uVar45 * 0x30;
          *(undefined1 (*) [16])(local_f8 + uVar45 * 0xc) = auVar135 | auVar171;
          auVar98._0_4_ = local_118._0_4_ & auVar171._0_4_;
          auVar98._4_4_ = local_118._4_4_ & auVar171._4_4_;
          auVar98._8_4_ = (uint)fStack_110 & auVar171._8_4_;
          auVar98._12_4_ = (uint)fStack_10c & auVar171._12_4_;
          auVar172._0_4_ = ~auVar171._0_4_ & local_1a8._0_4_;
          auVar172._4_4_ = ~auVar171._4_4_ & local_1a8._4_4_;
          auVar172._8_4_ = ~auVar171._8_4_ & (uint)fStack_1a0;
          auVar172._12_4_ = ~auVar171._12_4_ & (uint)fStack_19c;
          *(undefined1 (*) [16])(afStack_e8 + uVar45 * 0xc) = auVar172 | auVar98;
          local_d0[uVar45 * 0xc + -2] = local_3f8;
          local_d0[uVar45 * 0xc + -1] = fStack_3f4;
          local_d0[uVar45 * 0xc] = (float)((int)local_4b0 + 1);
          uVar45 = (ulong)((int)uVar45 + 1);
        }
      }
    }
    fVar140 = ray->tfar;
    uVar43 = uVar45;
    do {
      if ((int)uVar43 == 0) {
        if (bVar46 != 0) {
          return local_609;
        }
        fVar140 = ray->tfar;
        auVar119._4_4_ = -(uint)(fStack_184 <= fVar140);
        auVar119._0_4_ = -(uint)(local_188 <= fVar140);
        auVar119._8_4_ = -(uint)(fStack_180 <= fVar140);
        auVar119._12_4_ = -(uint)(fStack_17c <= fVar140);
        uVar55 = movmskps((int)lVar44,auVar119);
        uVar55 = (uint)local_2b0 & uVar55;
        local_609 = uVar55 != 0;
        if (!local_609) {
          return local_609;
        }
        goto LAB_00b580ca;
      }
      uVar45 = (ulong)((int)uVar43 - 1);
      local_4a8.valid._0_4_ =
           -(uint)(local_4c8 + afStack_e8[uVar45 * 0xc] <= fVar140) & local_f8[uVar45 * 0xc];
      local_4a8.valid._4_4_ =
           -(uint)(fStack_4c4 + afStack_e8[uVar45 * 0xc + 1] <= fVar140) &
           local_f8[uVar45 * 0xc + 1];
      local_4a8.geometryUserPtr._0_4_ =
           -(uint)(fStack_4c0 + afStack_e8[uVar45 * 0xc + 2] <= fVar140) &
           local_f8[uVar45 * 0xc + 2];
      local_4a8.geometryUserPtr._4_4_ =
           -(uint)(fStack_4bc + afStack_e8[uVar45 * 0xc + 3] <= fVar140) &
           (uint)afStack_e8[uVar45 * 0xc + -1];
      iVar41 = movmskps((int)lVar44,(undefined1  [16])local_4a8._0_16_);
      lVar44 = CONCAT44((int)((ulong)lVar44 >> 0x20),iVar41);
      if (iVar41 != 0) {
        auVar136._0_4_ = (uint)afStack_e8[uVar45 * 0xc] & (uint)local_4a8.valid;
        auVar136._4_4_ = (uint)afStack_e8[uVar45 * 0xc + 1] & local_4a8.valid._4_4_;
        auVar136._8_4_ = (uint)afStack_e8[uVar45 * 0xc + 2] & (uint)local_4a8.geometryUserPtr;
        auVar136._12_4_ = (uint)afStack_e8[uVar45 * 0xc + 3] & local_4a8.geometryUserPtr._4_4_;
        auVar155._0_8_ =
             CONCAT44(~local_4a8.valid._4_4_,~(uint)local_4a8.valid) & 0x7f8000007f800000;
        auVar155._8_4_ = ~(uint)local_4a8.geometryUserPtr & 0x7f800000;
        auVar155._12_4_ = ~local_4a8.geometryUserPtr._4_4_ & 0x7f800000;
        auVar155 = auVar155 | auVar136;
        auVar173._4_4_ = auVar155._0_4_;
        auVar173._0_4_ = auVar155._4_4_;
        auVar173._8_4_ = auVar155._12_4_;
        auVar173._12_4_ = auVar155._8_4_;
        auVar70 = minps(auVar173,auVar155);
        auVar137._0_8_ = auVar70._8_8_;
        auVar137._8_4_ = auVar70._0_4_;
        auVar137._12_4_ = auVar70._4_4_;
        auVar70 = minps(auVar137,auVar70);
        auVar138._0_8_ =
             CONCAT44(-(uint)(auVar70._4_4_ == auVar155._4_4_) & local_4a8.valid._4_4_,
                      -(uint)(auVar70._0_4_ == auVar155._0_4_) & (uint)local_4a8.valid);
        auVar138._8_4_ = -(uint)(auVar70._8_4_ == auVar155._8_4_) & (uint)local_4a8.geometryUserPtr;
        auVar138._12_4_ =
             -(uint)(auVar70._12_4_ == auVar155._12_4_) & local_4a8.geometryUserPtr._4_4_;
        iVar47 = movmskps((int)lVar49,auVar138);
        auVar118 = (undefined1  [16])local_4a8._0_16_;
        if (iVar47 != 0) {
          auVar118._8_4_ = auVar138._8_4_;
          auVar118._0_8_ = auVar138._0_8_;
          auVar118._12_4_ = auVar138._12_4_;
        }
        fVar60 = local_d0[uVar45 * 0xc + -2];
        fVar101 = local_d0[uVar45 * 0xc + -1];
        uVar48 = movmskps(iVar47,auVar118);
        uVar50 = CONCAT44((int)((ulong)lVar49 >> 0x20),uVar48);
        lVar49 = 0;
        if (uVar50 != 0) {
          for (; (uVar50 >> lVar49 & 1) == 0; lVar49 = lVar49 + 1) {
          }
        }
        *(undefined4 *)((long)&local_4a8.valid + lVar49 * 4) = 0;
        iVar47 = movmskps((int)pRVar51,(undefined1  [16])local_4a8._0_16_);
        pRVar51 = (RTCFilterFunctionNArguments *)(ulong)(uint)local_d0[uVar45 * 0xc];
        if (iVar47 == 0) {
          uVar43 = uVar45;
        }
        *(undefined1 (*) [16])(local_f8 + uVar45 * 0xc) = (undefined1  [16])local_4a8._0_16_;
        fVar101 = fVar101 - fVar60;
        local_438 = CONCAT44(fVar101 * 0.33333334 + fVar60,fVar101 * 0.0 + fVar60);
        fStack_430 = fVar101 * 0.6666667 + fVar60;
        fStack_42c = fVar101 * 1.0 + fVar60;
        local_3f8 = *(float *)((long)&local_438 + lVar49 * 4);
        fStack_3f4 = *(float *)((long)&local_438 + lVar49 * 4 + 4);
        uStack_3f0 = 0;
        uStack_3ec = 0;
        uVar45 = uVar43;
        local_4b0 = pRVar51;
      }
      uVar43 = uVar45;
    } while ((char)iVar41 == '\0');
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }